

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_h<embree::avx2::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [16];
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  int iVar8;
  Geometry *pGVar9;
  code *pcVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [28];
  undefined1 auVar79 [12];
  byte bVar80;
  uint uVar81;
  ulong uVar82;
  long lVar83;
  ulong uVar84;
  uint uVar85;
  long lVar86;
  bool bVar87;
  Geometry *geometry;
  undefined8 uVar88;
  float fVar107;
  vint4 bi_2;
  undefined1 auVar89 [16];
  float fVar106;
  float fVar108;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar95 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined4 uVar112;
  undefined8 uVar113;
  vint4 bi_1;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  vint4 ai_2;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar140 [16];
  undefined1 auVar146 [64];
  vint4 ai;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 bi;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined4 uVar167;
  vint4 ai_1;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar190 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  float fVar188;
  float fVar194;
  undefined1 auVar189 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  float fVar200;
  float fVar201;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar199 [64];
  undefined1 auVar206 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  bool local_835;
  int local_834;
  RayQueryContext *local_830;
  Ray *local_828;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  Primitive *local_7c8;
  float local_7c0;
  undefined4 uStack_7bc;
  undefined4 uStack_7b8;
  undefined4 uStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined4 uStack_7a4;
  ulong local_790;
  Precalculations *local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined8 local_660;
  undefined4 local_658;
  float local_654;
  undefined4 local_650;
  undefined4 local_64c;
  undefined4 local_648;
  uint local_644;
  uint local_640;
  ulong local_628;
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_430 [16];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  int local_280;
  int local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined4 uStack_144;
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_788 = pre;
  PVar7 = prim[1];
  uVar84 = (ulong)(byte)PVar7;
  fVar125 = *(float *)(prim + uVar84 * 0x19 + 0x12);
  auVar17 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar84 * 0x19 + 6));
  auVar151._0_4_ = fVar125 * (ray->dir).field_0.m128[0];
  auVar151._4_4_ = fVar125 * (ray->dir).field_0.m128[1];
  auVar151._8_4_ = fVar125 * (ray->dir).field_0.m128[2];
  auVar151._12_4_ = fVar125 * (ray->dir).field_0.m128[3];
  auVar89._0_4_ = fVar125 * auVar17._0_4_;
  auVar89._4_4_ = fVar125 * auVar17._4_4_;
  auVar89._8_4_ = fVar125 * auVar17._8_4_;
  auVar89._12_4_ = fVar125 * auVar17._12_4_;
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 4 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 5 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 6 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0xb + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar7 * 0xc + uVar84 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  uVar82 = (ulong)(uint)((int)(uVar84 * 9) * 2);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + uVar84 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  uVar82 = (ulong)(uint)((int)(uVar84 * 5) << 2);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 6)));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar195._4_4_ = auVar151._0_4_;
  auVar195._0_4_ = auVar151._0_4_;
  auVar195._8_4_ = auVar151._0_4_;
  auVar195._12_4_ = auVar151._0_4_;
  auVar115 = vshufps_avx(auVar151,auVar151,0x55);
  auVar90 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar125 = auVar90._0_4_;
  auVar184._0_4_ = fVar125 * auVar13._0_4_;
  fVar106 = auVar90._4_4_;
  auVar184._4_4_ = fVar106 * auVar13._4_4_;
  fVar107 = auVar90._8_4_;
  auVar184._8_4_ = fVar107 * auVar13._8_4_;
  fVar108 = auVar90._12_4_;
  auVar184._12_4_ = fVar108 * auVar13._12_4_;
  auVar180._0_4_ = auVar16._0_4_ * fVar125;
  auVar180._4_4_ = auVar16._4_4_ * fVar106;
  auVar180._8_4_ = auVar16._8_4_ * fVar107;
  auVar180._12_4_ = auVar16._12_4_ * fVar108;
  auVar168._0_4_ = auVar126._0_4_ * fVar125;
  auVar168._4_4_ = auVar126._4_4_ * fVar106;
  auVar168._8_4_ = auVar126._8_4_ * fVar107;
  auVar168._12_4_ = auVar126._12_4_ * fVar108;
  auVar90 = vfmadd231ps_fma(auVar184,auVar115,auVar12);
  auVar116 = vfmadd231ps_fma(auVar180,auVar115,auVar15);
  auVar115 = vfmadd231ps_fma(auVar168,auVar91,auVar115);
  auVar138 = vfmadd231ps_fma(auVar90,auVar195,auVar17);
  auVar116 = vfmadd231ps_fma(auVar116,auVar195,auVar14);
  auVar148 = vfmadd231ps_fma(auVar115,auVar92,auVar195);
  auVar196._4_4_ = auVar89._0_4_;
  auVar196._0_4_ = auVar89._0_4_;
  auVar196._8_4_ = auVar89._0_4_;
  auVar196._12_4_ = auVar89._0_4_;
  auVar115 = vshufps_avx(auVar89,auVar89,0x55);
  auVar90 = vshufps_avx(auVar89,auVar89,0xaa);
  fVar125 = auVar90._0_4_;
  auVar152._0_4_ = fVar125 * auVar13._0_4_;
  fVar106 = auVar90._4_4_;
  auVar152._4_4_ = fVar106 * auVar13._4_4_;
  fVar107 = auVar90._8_4_;
  auVar152._8_4_ = fVar107 * auVar13._8_4_;
  fVar108 = auVar90._12_4_;
  auVar152._12_4_ = fVar108 * auVar13._12_4_;
  auVar114._0_4_ = auVar16._0_4_ * fVar125;
  auVar114._4_4_ = auVar16._4_4_ * fVar106;
  auVar114._8_4_ = auVar16._8_4_ * fVar107;
  auVar114._12_4_ = auVar16._12_4_ * fVar108;
  auVar90._0_4_ = auVar126._0_4_ * fVar125;
  auVar90._4_4_ = auVar126._4_4_ * fVar106;
  auVar90._8_4_ = auVar126._8_4_ * fVar107;
  auVar90._12_4_ = auVar126._12_4_ * fVar108;
  auVar12 = vfmadd231ps_fma(auVar152,auVar115,auVar12);
  auVar13 = vfmadd231ps_fma(auVar114,auVar115,auVar15);
  auVar15 = vfmadd231ps_fma(auVar90,auVar115,auVar91);
  auVar16 = vfmadd231ps_fma(auVar12,auVar196,auVar17);
  auVar91 = vfmadd231ps_fma(auVar13,auVar196,auVar14);
  auVar126 = vfmadd231ps_fma(auVar15,auVar196,auVar92);
  local_2f0._8_4_ = 0x7fffffff;
  local_2f0._0_8_ = 0x7fffffff7fffffff;
  local_2f0._12_4_ = 0x7fffffff;
  auVar17 = vandps_avx(auVar138,local_2f0);
  auVar147._8_4_ = 0x219392ef;
  auVar147._0_8_ = 0x219392ef219392ef;
  auVar147._12_4_ = 0x219392ef;
  auVar17 = vcmpps_avx(auVar17,auVar147,1);
  auVar12 = vblendvps_avx(auVar138,auVar147,auVar17);
  auVar17 = vandps_avx(auVar116,local_2f0);
  auVar17 = vcmpps_avx(auVar17,auVar147,1);
  auVar13 = vblendvps_avx(auVar116,auVar147,auVar17);
  auVar17 = vandps_avx(auVar148,local_2f0);
  auVar17 = vcmpps_avx(auVar17,auVar147,1);
  auVar17 = vblendvps_avx(auVar148,auVar147,auVar17);
  auVar14 = vrcpps_avx(auVar12);
  auVar164._8_4_ = 0x3f800000;
  auVar164._0_8_ = &DAT_3f8000003f800000;
  auVar164._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar14,auVar164);
  auVar14 = vfmadd132ps_fma(auVar12,auVar14,auVar14);
  auVar12 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar12,auVar164);
  auVar15 = vfmadd132ps_fma(auVar13,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar17);
  auVar13 = vfnmadd213ps_fma(auVar17,auVar12,auVar164);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar84 * 7 + 6);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar92 = vfmadd132ps_fma(auVar13,auVar12,auVar12);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar16);
  auVar148._0_4_ = auVar14._0_4_ * auVar17._0_4_;
  auVar148._4_4_ = auVar14._4_4_ * auVar17._4_4_;
  auVar148._8_4_ = auVar14._8_4_ * auVar17._8_4_;
  auVar148._12_4_ = auVar14._12_4_ * auVar17._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar84 * 9 + 6);
  auVar17 = vpmovsxwd_avx(auVar12);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar16);
  auVar153._0_4_ = auVar14._0_4_ * auVar17._0_4_;
  auVar153._4_4_ = auVar14._4_4_ * auVar17._4_4_;
  auVar153._8_4_ = auVar14._8_4_ * auVar17._8_4_;
  auVar153._12_4_ = auVar14._12_4_ * auVar17._12_4_;
  auVar116._1_3_ = 0;
  auVar116[0] = PVar7;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar12 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar84 * -2 + 6);
  auVar17 = vpmovsxwd_avx(auVar14);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar91);
  auVar169._0_4_ = auVar17._0_4_ * auVar15._0_4_;
  auVar169._4_4_ = auVar17._4_4_ * auVar15._4_4_;
  auVar169._8_4_ = auVar17._8_4_ * auVar15._8_4_;
  auVar169._12_4_ = auVar17._12_4_ * auVar15._12_4_;
  auVar17 = vcvtdq2ps_avx(auVar12);
  auVar17 = vsubps_avx(auVar17,auVar91);
  auVar115._0_4_ = auVar15._0_4_ * auVar17._0_4_;
  auVar115._4_4_ = auVar15._4_4_ * auVar17._4_4_;
  auVar115._8_4_ = auVar15._8_4_ * auVar17._8_4_;
  auVar115._12_4_ = auVar15._12_4_ * auVar17._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar82 + uVar84 + 6);
  auVar17 = vpmovsxwd_avx(auVar15);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar126);
  auVar138._0_4_ = auVar92._0_4_ * auVar17._0_4_;
  auVar138._4_4_ = auVar92._4_4_ * auVar17._4_4_;
  auVar138._8_4_ = auVar92._8_4_ * auVar17._8_4_;
  auVar138._12_4_ = auVar92._12_4_ * auVar17._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar84 * 0x17 + 6);
  auVar17 = vpmovsxwd_avx(auVar16);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar126);
  auVar91._0_4_ = auVar92._0_4_ * auVar17._0_4_;
  auVar91._4_4_ = auVar92._4_4_ * auVar17._4_4_;
  auVar91._8_4_ = auVar92._8_4_ * auVar17._8_4_;
  auVar91._12_4_ = auVar92._12_4_ * auVar17._12_4_;
  auVar17 = vpminsd_avx(auVar148,auVar153);
  auVar12 = vpminsd_avx(auVar169,auVar115);
  auVar17 = vmaxps_avx(auVar17,auVar12);
  auVar12 = vpminsd_avx(auVar138,auVar91);
  uVar112 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar174._4_4_ = uVar112;
  auVar174._0_4_ = uVar112;
  auVar174._8_4_ = uVar112;
  auVar174._12_4_ = uVar112;
  auVar12 = vmaxps_avx(auVar12,auVar174);
  auVar17 = vmaxps_avx(auVar17,auVar12);
  local_300._0_4_ = auVar17._0_4_ * 0.99999964;
  local_300._4_4_ = auVar17._4_4_ * 0.99999964;
  local_300._8_4_ = auVar17._8_4_ * 0.99999964;
  local_300._12_4_ = auVar17._12_4_ * 0.99999964;
  auVar17 = vpmaxsd_avx(auVar148,auVar153);
  auVar12 = vpmaxsd_avx(auVar169,auVar115);
  auVar17 = vminps_avx(auVar17,auVar12);
  auVar12 = vpmaxsd_avx(auVar138,auVar91);
  fVar125 = ray->tfar;
  auVar126._4_4_ = fVar125;
  auVar126._0_4_ = fVar125;
  auVar126._8_4_ = fVar125;
  auVar126._12_4_ = fVar125;
  auVar12 = vminps_avx(auVar12,auVar126);
  auVar17 = vminps_avx(auVar17,auVar12);
  auVar92._0_4_ = auVar17._0_4_ * 1.0000004;
  auVar92._4_4_ = auVar17._4_4_ * 1.0000004;
  auVar92._8_4_ = auVar17._8_4_ * 1.0000004;
  auVar92._12_4_ = auVar17._12_4_ * 1.0000004;
  auVar116[4] = PVar7;
  auVar116._5_3_ = 0;
  auVar116[8] = PVar7;
  auVar116._9_3_ = 0;
  auVar116[0xc] = PVar7;
  auVar116._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar116,_DAT_01ff0cf0);
  auVar17 = vcmpps_avx(local_300,auVar92,2);
  auVar17 = vandps_avx(auVar17,auVar12);
  uVar81 = vmovmskps_avx(auVar17);
  local_835 = uVar81 != 0;
  if (local_835) {
    uVar81 = uVar81 & 0xff;
    local_4c0 = mm_lookupmask_ps._16_8_;
    uStack_4b8 = mm_lookupmask_ps._24_8_;
    uStack_4b0 = mm_lookupmask_ps._16_8_;
    uStack_4a8 = mm_lookupmask_ps._24_8_;
    do {
      lVar20 = 0;
      for (uVar82 = (ulong)uVar81; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
        lVar20 = lVar20 + 1;
      }
      local_790 = (ulong)*(uint *)(prim + 2);
      pGVar9 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
      local_628 = (ulong)*(uint *)(prim + lVar20 * 4 + 6);
      uVar82 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                               (ulong)*(uint *)(prim + lVar20 * 4 + 6) *
                               pGVar9[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar86 = (long)pGVar9[1].intersectionFilterN * uVar82;
      lVar83 = (long)pGVar9[1].intersectionFilterN * (uVar82 + 1);
      lVar20 = *(long *)&pGVar9[1].time_range.upper;
      local_590 = *(undefined1 (*) [16])(lVar20 + lVar86);
      local_430 = *(undefined1 (*) [16])(lVar20 + lVar83);
      uVar112 = *(undefined4 *)(lVar20 + 0xc + lVar86);
      auVar165._4_4_ = uVar112;
      auVar165._0_4_ = uVar112;
      auVar165._8_4_ = uVar112;
      auVar165._12_4_ = uVar112;
      local_140._16_4_ = uVar112;
      local_140._0_16_ = auVar165;
      local_140._20_4_ = uVar112;
      local_140._24_4_ = uVar112;
      local_140._28_4_ = uVar112;
      iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar125 = *(float *)(lVar20 + 0xc + lVar83);
      auVar197._4_4_ = fVar125;
      auVar197._0_4_ = fVar125;
      auVar197._8_4_ = fVar125;
      auVar197._12_4_ = fVar125;
      fStack_150 = fVar125;
      _local_160 = auVar197;
      fStack_14c = fVar125;
      fStack_148 = fVar125;
      uStack_144 = fVar125;
      lVar20 = (long)iVar8 * 0x44;
      auVar93._8_4_ = 0xbeaaaaab;
      auVar93._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar93._12_4_ = 0xbeaaaaab;
      local_4d0 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                    (pGVar9[2].intersectionFilterN +
                                    uVar82 * (long)pGVar9[2].pointQueryFunc),local_590,auVar93);
      local_4e0 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar9[2].intersectionFilterN +
                                   (long)pGVar9[2].pointQueryFunc * (uVar82 + 1)),local_430,auVar93)
      ;
      aVar4 = (ray->org).field_0;
      auVar115 = local_590;
      auVar12 = vsubps_avx(local_590,(undefined1  [16])aVar4);
      uVar112 = auVar12._0_4_;
      auVar127._4_4_ = uVar112;
      auVar127._0_4_ = uVar112;
      auVar127._8_4_ = uVar112;
      auVar127._12_4_ = uVar112;
      auVar17 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      aVar5 = (local_788->ray_space).vx.field_0;
      aVar6 = (local_788->ray_space).vy.field_0;
      fVar106 = (local_788->ray_space).vz.field_0.m128[0];
      fVar107 = (local_788->ray_space).vz.field_0.m128[1];
      fVar108 = (local_788->ray_space).vz.field_0.m128[2];
      fVar109 = (local_788->ray_space).vz.field_0.m128[3];
      auVar170._0_4_ = auVar12._0_4_ * fVar106;
      auVar170._4_4_ = auVar12._4_4_ * fVar107;
      auVar170._8_4_ = auVar12._8_4_ * fVar108;
      auVar170._12_4_ = auVar12._12_4_ * fVar109;
      auVar17 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar6,auVar17);
      auVar16 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar127);
      auVar17 = vinsertps_avx(auVar16,auVar165,0x30);
      auVar13 = vsubps_avx(local_4d0,(undefined1  [16])aVar4);
      auVar116 = local_4d0;
      uVar112 = auVar13._0_4_;
      auVar139._4_4_ = uVar112;
      auVar139._0_4_ = uVar112;
      auVar139._8_4_ = uVar112;
      auVar139._12_4_ = uVar112;
      auVar12 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar181._0_4_ = auVar13._0_4_ * fVar106;
      auVar181._4_4_ = auVar13._4_4_ * fVar107;
      auVar181._8_4_ = auVar13._8_4_ * fVar108;
      auVar181._12_4_ = auVar13._12_4_ * fVar109;
      auVar12 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar6,auVar12);
      auVar92 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar5,auVar139);
      auVar90 = local_4e0;
      auVar14 = vsubps_avx(local_4e0,(undefined1  [16])aVar4);
      auVar12 = vshufps_avx(auVar14,auVar14,0x55);
      auVar13 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar166._0_4_ = auVar13._0_4_ * fVar106;
      auVar166._4_4_ = auVar13._4_4_ * fVar107;
      auVar166._8_4_ = auVar13._8_4_ * fVar108;
      auVar166._12_4_ = auVar13._12_4_ * fVar109;
      auVar13 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar6,auVar12);
      auVar12 = vblendps_avx(auVar92,local_4d0,8);
      auVar128._0_4_ = auVar14._0_4_;
      auVar128._4_4_ = auVar128._0_4_;
      auVar128._8_4_ = auVar128._0_4_;
      auVar128._12_4_ = auVar128._0_4_;
      auVar91 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar5,auVar128);
      auVar138 = local_430;
      auVar14 = vsubps_avx(local_430,(undefined1  [16])aVar4);
      auVar13 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar189._0_4_ = auVar13._0_4_ * fVar106;
      auVar189._4_4_ = auVar13._4_4_ * fVar107;
      auVar189._8_4_ = auVar13._8_4_ * fVar108;
      auVar189._12_4_ = auVar13._12_4_ * fVar109;
      auVar13 = vshufps_avx(auVar14,auVar14,0x55);
      auVar15 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar6,auVar13);
      auVar13 = vblendps_avx(auVar91,local_4e0,8);
      auVar94._0_4_ = auVar14._0_4_;
      auVar94._4_4_ = auVar94._0_4_;
      auVar94._8_4_ = auVar94._0_4_;
      auVar94._12_4_ = auVar94._0_4_;
      auVar126 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar94);
      auVar14 = vinsertps_avx(auVar126,auVar197,0x30);
      auVar17 = vandps_avx(auVar17,local_2f0);
      auVar12 = vandps_avx(auVar12,local_2f0);
      auVar15 = vmaxps_avx(auVar17,auVar12);
      auVar17 = vandps_avx(auVar13,local_2f0);
      auVar12 = vandps_avx(auVar14,local_2f0);
      auVar17 = vmaxps_avx(auVar17,auVar12);
      auVar17 = vmaxps_avx(auVar15,auVar17);
      auVar12 = vmovshdup_avx(auVar17);
      auVar12 = vmaxss_avx(auVar12,auVar17);
      auVar17 = vshufpd_avx(auVar17,auVar17,1);
      auVar17 = vmaxss_avx(auVar17,auVar12);
      auVar12 = vmovshdup_avx(auVar16);
      uVar88 = auVar12._0_8_;
      local_460._8_8_ = uVar88;
      local_460._0_8_ = uVar88;
      local_460._16_8_ = uVar88;
      local_460._24_8_ = uVar88;
      auVar12 = vmovshdup_avx(auVar92);
      local_7c0 = auVar92._0_4_;
      uVar88 = auVar12._0_8_;
      local_5c0._8_8_ = uVar88;
      local_5c0._0_8_ = uVar88;
      local_5c0._16_8_ = uVar88;
      local_5c0._24_8_ = uVar88;
      auVar150 = *(undefined1 (*) [32])(bezier_basis0 + lVar20 + 0x908);
      auVar12 = vmovshdup_avx(auVar91);
      uVar88 = auVar12._0_8_;
      local_6c0._8_8_ = uVar88;
      local_6c0._0_8_ = uVar88;
      local_6c0._16_8_ = uVar88;
      local_6c0._24_8_ = uVar88;
      auVar12 = vmovshdup_avx(auVar126);
      uVar88 = auVar12._0_8_;
      uVar112 = auVar91._0_4_;
      local_6a0._4_4_ = uVar112;
      local_6a0._0_4_ = uVar112;
      local_6a0._8_4_ = uVar112;
      local_6a0._12_4_ = uVar112;
      local_6a0._16_4_ = uVar112;
      local_6a0._20_4_ = uVar112;
      local_6a0._24_4_ = uVar112;
      local_6a0._28_4_ = uVar112;
      pauVar1 = (undefined1 (*) [32])(bezier_basis0 + lVar20 + 0xd8c);
      fVar106 = *(float *)*pauVar1;
      fVar107 = *(float *)(bezier_basis0 + lVar20 + 0xd90);
      fVar108 = *(float *)(bezier_basis0 + lVar20 + 0xd94);
      fVar109 = *(float *)(bezier_basis0 + lVar20 + 0xd98);
      fVar110 = *(float *)(bezier_basis0 + lVar20 + 0xd9c);
      fVar111 = *(float *)(bezier_basis0 + lVar20 + 0xda0);
      fVar188 = *(float *)(bezier_basis0 + lVar20 + 0xda4);
      auVar78 = *(undefined1 (*) [28])*pauVar1;
      local_680 = auVar126._0_4_;
      auVar142._0_4_ = fVar106 * local_680;
      auVar142._4_4_ = fVar107 * local_680;
      auVar142._8_4_ = fVar108 * local_680;
      auVar142._12_4_ = fVar109 * local_680;
      auVar142._16_4_ = fVar110 * local_680;
      auVar142._20_4_ = fVar111 * local_680;
      auVar142._24_4_ = fVar188 * local_680;
      auVar142._28_4_ = 0;
      auVar13 = vfmadd231ps_fma(auVar142,auVar150,local_6a0);
      local_600 = auVar12._0_4_;
      auVar133._0_4_ = fVar106 * local_600;
      fStack_5fc = auVar12._4_4_;
      auVar133._4_4_ = fVar107 * fStack_5fc;
      auVar133._8_4_ = fVar108 * local_600;
      auVar133._12_4_ = fVar109 * fStack_5fc;
      auVar133._16_4_ = fVar110 * local_600;
      auVar133._20_4_ = fVar111 * fStack_5fc;
      auVar133._24_4_ = fVar188 * local_600;
      auVar133._28_4_ = 0;
      auVar12 = vfmadd231ps_fma(auVar133,auVar150,local_6c0);
      auVar133 = *(undefined1 (*) [32])(bezier_basis0 + lVar20 + 0x484);
      local_740._4_4_ = local_7c0;
      local_740._0_4_ = local_7c0;
      local_740._8_4_ = local_7c0;
      local_740._12_4_ = local_7c0;
      local_740._16_4_ = local_7c0;
      local_740._20_4_ = local_7c0;
      local_740._24_4_ = local_7c0;
      local_740._28_4_ = local_7c0;
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar133,local_740);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar133,local_5c0);
      auVar142 = *(undefined1 (*) [32])(bezier_basis0 + lVar20);
      uVar167 = auVar16._0_4_;
      local_760._4_4_ = uVar167;
      local_760._0_4_ = uVar167;
      local_760._8_4_ = uVar167;
      local_760._12_4_ = uVar167;
      local_760._16_4_ = uVar167;
      local_760._20_4_ = uVar167;
      local_760._24_4_ = uVar167;
      local_760._28_4_ = uVar167;
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar142,local_760);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar142,local_460);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar20 + 0x908);
      fVar69 = *(float *)(bezier_basis1 + lVar20 + 0xd8c);
      fVar70 = *(float *)(bezier_basis1 + lVar20 + 0xd90);
      fVar71 = *(float *)(bezier_basis1 + lVar20 + 0xd94);
      fVar72 = *(float *)(bezier_basis1 + lVar20 + 0xd98);
      fVar73 = *(float *)(bezier_basis1 + lVar20 + 0xd9c);
      fVar74 = *(float *)(bezier_basis1 + lVar20 + 0xda0);
      fVar75 = *(float *)(bezier_basis1 + lVar20 + 0xda4);
      fStack_67c = local_680;
      fStack_678 = local_680;
      fStack_674 = local_680;
      fStack_670 = local_680;
      fStack_66c = local_680;
      fStack_668 = local_680;
      fStack_664 = local_680;
      auVar105._4_4_ = fVar70 * local_680;
      auVar105._0_4_ = fVar69 * local_680;
      auVar105._8_4_ = fVar71 * local_680;
      auVar105._12_4_ = fVar72 * local_680;
      auVar105._16_4_ = fVar73 * local_680;
      auVar105._20_4_ = fVar74 * local_680;
      auVar105._24_4_ = fVar75 * local_680;
      auVar105._28_4_ = local_680;
      auVar14 = vfmadd231ps_fma(auVar105,auVar103,local_6a0);
      auVar175._4_4_ = fVar70 * fStack_5fc;
      auVar175._0_4_ = fVar69 * local_600;
      auVar175._8_4_ = fVar71 * local_600;
      auVar175._12_4_ = fVar72 * fStack_5fc;
      auVar175._16_4_ = fVar73 * local_600;
      auVar175._20_4_ = fVar74 * fStack_5fc;
      auVar175._24_4_ = fVar75 * local_600;
      auVar175._28_4_ = uVar112;
      auVar15 = vfmadd231ps_fma(auVar175,auVar103,local_6c0);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar20 + 0x484);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar105,local_740);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar105,local_5c0);
      auVar175 = *(undefined1 (*) [32])(bezier_basis1 + lVar20);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar175,local_760);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar175,local_460);
      auVar96 = ZEXT1632(auVar14);
      auVar143 = ZEXT1632(auVar13);
      auVar136 = vsubps_avx(auVar96,auVar143);
      auVar117 = ZEXT1632(auVar15);
      local_340 = ZEXT1632(auVar12);
      auVar104 = vsubps_avx(auVar117,local_340);
      auVar97._0_4_ = auVar12._0_4_ * auVar136._0_4_;
      auVar97._4_4_ = auVar12._4_4_ * auVar136._4_4_;
      auVar97._8_4_ = auVar12._8_4_ * auVar136._8_4_;
      auVar97._12_4_ = auVar12._12_4_ * auVar136._12_4_;
      auVar97._16_4_ = auVar136._16_4_ * 0.0;
      auVar97._20_4_ = auVar136._20_4_ * 0.0;
      auVar97._24_4_ = auVar136._24_4_ * 0.0;
      auVar97._28_4_ = 0;
      fVar194 = auVar104._0_4_;
      auVar118._0_4_ = fVar194 * auVar13._0_4_;
      fVar200 = auVar104._4_4_;
      auVar118._4_4_ = fVar200 * auVar13._4_4_;
      fVar201 = auVar104._8_4_;
      auVar118._8_4_ = fVar201 * auVar13._8_4_;
      fVar202 = auVar104._12_4_;
      auVar118._12_4_ = fVar202 * auVar13._12_4_;
      fVar203 = auVar104._16_4_;
      auVar118._16_4_ = fVar203 * 0.0;
      fVar204 = auVar104._20_4_;
      auVar118._20_4_ = fVar204 * 0.0;
      fVar205 = auVar104._24_4_;
      auVar118._24_4_ = fVar205 * 0.0;
      auVar118._28_4_ = 0;
      auVar97 = vsubps_avx(auVar97,auVar118);
      auVar12 = vpermilps_avx(local_4d0,0xff);
      uVar113 = auVar12._0_8_;
      local_80._8_8_ = uVar113;
      local_80._0_8_ = uVar113;
      local_80._16_8_ = uVar113;
      local_80._24_8_ = uVar113;
      auVar13 = vpermilps_avx(local_4e0,0xff);
      local_a0._0_8_ = auVar13._0_8_;
      local_a0._8_8_ = local_a0._0_8_;
      local_a0._16_8_ = local_a0._0_8_;
      local_a0._24_8_ = local_a0._0_8_;
      _local_360 = *pauVar1;
      auVar118 = _local_360;
      auVar179._4_4_ = fVar107 * fVar125;
      auVar179._0_4_ = fVar106 * fVar125;
      auVar179._8_4_ = fVar108 * fVar125;
      auVar179._12_4_ = fVar109 * fVar125;
      auVar179._16_4_ = fVar110 * fVar125;
      auVar179._20_4_ = fVar111 * fVar125;
      auVar179._24_4_ = fVar188 * fVar125;
      auVar179._28_4_ = *(undefined4 *)(bezier_basis0 + lVar20 + 0xda8);
      auVar13 = vfmadd231ps_fma(auVar179,local_a0,auVar150);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar133,local_80);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar142,local_140);
      auVar182._4_4_ = fVar70 * fVar125;
      auVar182._0_4_ = fVar69 * fVar125;
      auVar182._8_4_ = fVar71 * fVar125;
      auVar182._12_4_ = fVar72 * fVar125;
      auVar182._16_4_ = fVar73 * fVar125;
      auVar182._20_4_ = fVar74 * fVar125;
      auVar182._24_4_ = fVar75 * fVar125;
      auVar182._28_4_ = auVar142._28_4_;
      auVar14 = vfmadd231ps_fma(auVar182,auVar103,local_a0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar105,local_80);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar175,local_140);
      auVar190._4_4_ = fVar200 * fVar200;
      auVar190._0_4_ = fVar194 * fVar194;
      auVar190._8_4_ = fVar201 * fVar201;
      auVar190._12_4_ = fVar202 * fVar202;
      auVar190._16_4_ = fVar203 * fVar203;
      auVar190._20_4_ = fVar204 * fVar204;
      auVar190._24_4_ = fVar205 * fVar205;
      auVar190._28_4_ = auVar12._4_4_;
      auVar12 = vfmadd231ps_fma(auVar190,auVar136,auVar136);
      auVar179 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
      auVar18._4_4_ = auVar179._4_4_ * auVar179._4_4_ * auVar12._4_4_;
      auVar18._0_4_ = auVar179._0_4_ * auVar179._0_4_ * auVar12._0_4_;
      auVar18._8_4_ = auVar179._8_4_ * auVar179._8_4_ * auVar12._8_4_;
      auVar18._12_4_ = auVar179._12_4_ * auVar179._12_4_ * auVar12._12_4_;
      auVar18._16_4_ = auVar179._16_4_ * auVar179._16_4_ * 0.0;
      auVar18._20_4_ = auVar179._20_4_ * auVar179._20_4_ * 0.0;
      auVar18._24_4_ = auVar179._24_4_ * auVar179._24_4_ * 0.0;
      auVar18._28_4_ = auVar179._28_4_;
      auVar19._4_4_ = auVar97._4_4_ * auVar97._4_4_;
      auVar19._0_4_ = auVar97._0_4_ * auVar97._0_4_;
      auVar19._8_4_ = auVar97._8_4_ * auVar97._8_4_;
      auVar19._12_4_ = auVar97._12_4_ * auVar97._12_4_;
      auVar19._16_4_ = auVar97._16_4_ * auVar97._16_4_;
      auVar19._20_4_ = auVar97._20_4_ * auVar97._20_4_;
      auVar19._24_4_ = auVar97._24_4_ * auVar97._24_4_;
      auVar19._28_4_ = 0;
      auVar179 = vcmpps_avx(auVar19,auVar18,2);
      local_7c0 = auVar17._0_4_ * 4.7683716e-07;
      local_400._0_4_ = (undefined4)iVar8;
      register0x00001204 = auVar126._4_12_;
      auVar98._4_4_ = local_400._0_4_;
      auVar98._0_4_ = local_400._0_4_;
      auVar98._8_4_ = local_400._0_4_;
      auVar98._12_4_ = local_400._0_4_;
      auVar98._16_4_ = local_400._0_4_;
      auVar98._20_4_ = local_400._0_4_;
      auVar98._24_4_ = local_400._0_4_;
      auVar98._28_4_ = local_400._0_4_;
      auVar97 = vcmpps_avx(_DAT_02020f40,auVar98,1);
      auVar12 = vpermilps_avx(auVar16,0xaa);
      uVar113 = auVar12._0_8_;
      auVar156._8_8_ = uVar113;
      auVar156._0_8_ = uVar113;
      auVar156._16_8_ = uVar113;
      auVar156._24_8_ = uVar113;
      auVar17 = vpermilps_avx(auVar92,0xaa);
      uVar113 = auVar17._0_8_;
      local_3e0._8_8_ = uVar113;
      local_3e0._0_8_ = uVar113;
      local_3e0._16_8_ = uVar113;
      local_3e0._24_8_ = uVar113;
      auVar17 = vpermilps_avx(auVar91,0xaa);
      uVar113 = auVar17._0_8_;
      local_320._8_8_ = uVar113;
      local_320._0_8_ = uVar113;
      local_320._16_8_ = uVar113;
      local_320._24_8_ = uVar113;
      auVar17 = vshufps_avx(auVar126,auVar126,0xaa);
      uVar113 = auVar17._0_8_;
      register0x00001508 = uVar113;
      local_580 = uVar113;
      register0x00001510 = uVar113;
      register0x00001518 = uVar113;
      auVar192 = ZEXT3264(_local_580);
      auVar182 = auVar97 & auVar179;
      uVar85 = *(uint *)((long)&(ray->org).field_0 + 0xc);
      local_780._0_16_ = ZEXT416(uVar85);
      fStack_5f8 = local_600;
      fStack_5f4 = fStack_5fc;
      fStack_5f0 = local_600;
      fStack_5ec = fStack_5fc;
      fStack_5e8 = local_600;
      fStack_5e4 = fStack_5fc;
      if ((((((((auVar182 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar182 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar182 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar182 >> 0x7f,0) == '\0') &&
            (auVar182 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar182 >> 0xbf,0) == '\0') &&
          (auVar182 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar182[0x1f]) {
        bVar87 = false;
        auVar124 = ZEXT3264(local_6c0);
        auVar163 = ZEXT3264(CONCAT428(fStack_5fc,
                                      CONCAT424(local_600,
                                                CONCAT420(fStack_5fc,
                                                          CONCAT416(local_600,
                                                                    CONCAT412(fStack_5fc,
                                                                              CONCAT48(local_600,
                                                                                       uVar88)))))))
        ;
        auVar183 = ZEXT3264(local_6a0);
        auVar173 = ZEXT3264(CONCAT428(local_680,
                                      CONCAT424(local_680,
                                                CONCAT420(local_680,
                                                          CONCAT416(local_680,
                                                                    CONCAT412(local_680,
                                                                              CONCAT48(local_680,
                                                                                       CONCAT44(
                                                  local_680,local_680))))))));
        auVar199 = ZEXT3264(local_740);
        auVar206 = ZEXT3264(local_760);
      }
      else {
        local_380 = vandps_avx(auVar179,auVar97);
        fVar188 = auVar17._0_4_;
        fVar194 = auVar17._4_4_;
        auVar21._4_4_ = fVar194 * fVar70;
        auVar21._0_4_ = fVar188 * fVar69;
        auVar21._8_4_ = fVar188 * fVar71;
        auVar21._12_4_ = fVar194 * fVar72;
        auVar21._16_4_ = fVar188 * fVar73;
        auVar21._20_4_ = fVar194 * fVar74;
        auVar21._24_4_ = fVar188 * fVar75;
        auVar21._28_4_ = local_380._28_4_;
        auVar17 = vfmadd213ps_fma(auVar103,local_320,auVar21);
        auVar17 = vfmadd213ps_fma(auVar105,local_3e0,ZEXT1632(auVar17));
        auVar17 = vfmadd213ps_fma(auVar175,auVar156,ZEXT1632(auVar17));
        local_360._0_4_ = auVar78._0_4_;
        local_360._4_4_ = auVar78._4_4_;
        fStack_358 = auVar78._8_4_;
        fStack_354 = auVar78._12_4_;
        fStack_350 = auVar78._16_4_;
        fStack_34c = auVar78._20_4_;
        fStack_348 = auVar78._24_4_;
        auVar99._0_4_ = fVar188 * (float)local_360._0_4_;
        auVar99._4_4_ = fVar194 * (float)local_360._4_4_;
        auVar99._8_4_ = fVar188 * fStack_358;
        auVar99._12_4_ = fVar194 * fStack_354;
        auVar99._16_4_ = fVar188 * fStack_350;
        auVar99._20_4_ = fVar194 * fStack_34c;
        auVar99._24_4_ = fVar188 * fStack_348;
        auVar99._28_4_ = 0;
        auVar15 = vfmadd213ps_fma(auVar150,local_320,auVar99);
        auVar15 = vfmadd213ps_fma(auVar133,local_3e0,ZEXT1632(auVar15));
        auVar150 = *(undefined1 (*) [32])(bezier_basis0 + lVar20 + 0x1210);
        auVar133 = *(undefined1 (*) [32])(bezier_basis0 + lVar20 + 0x1694);
        auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar20 + 0x1b18);
        local_720 = auVar156;
        fVar125 = *(float *)(bezier_basis0 + lVar20 + 0x1f9c);
        fVar106 = *(float *)(bezier_basis0 + lVar20 + 0x1fa0);
        fVar107 = *(float *)(bezier_basis0 + lVar20 + 0x1fa4);
        fVar108 = *(float *)(bezier_basis0 + lVar20 + 0x1fa8);
        fVar109 = *(float *)(bezier_basis0 + lVar20 + 0x1fac);
        fVar110 = *(float *)(bezier_basis0 + lVar20 + 0x1fb0);
        fVar111 = *(float *)(bezier_basis0 + lVar20 + 0x1fb4);
        auVar22._4_4_ = local_680 * fVar106;
        auVar22._0_4_ = local_680 * fVar125;
        auVar22._8_4_ = local_680 * fVar107;
        auVar22._12_4_ = local_680 * fVar108;
        auVar22._16_4_ = local_680 * fVar109;
        auVar22._20_4_ = local_680 * fVar110;
        auVar22._24_4_ = local_680 * fVar111;
        auVar22._28_4_ = auVar12._4_4_;
        auVar23._4_4_ = fVar106 * fStack_5fc;
        auVar23._0_4_ = fVar125 * local_600;
        auVar23._8_4_ = fVar107 * local_600;
        auVar23._12_4_ = fVar108 * fStack_5fc;
        auVar23._16_4_ = fVar109 * local_600;
        auVar23._20_4_ = fVar110 * fStack_5fc;
        auVar23._24_4_ = fVar111 * local_600;
        auVar23._28_4_ = auVar103._28_4_;
        auVar103._4_4_ = fVar194 * fVar106;
        auVar103._0_4_ = fVar188 * fVar125;
        auVar103._8_4_ = fVar188 * fVar107;
        auVar103._12_4_ = fVar194 * fVar108;
        auVar103._16_4_ = fVar188 * fVar109;
        auVar103._20_4_ = fVar194 * fVar110;
        auVar103._24_4_ = fVar188 * fVar111;
        auVar103._28_4_ = *(undefined4 *)(bezier_basis1 + lVar20 + 0xda8);
        uStack_7bc = 0;
        uStack_7b8 = 0;
        uStack_7b4 = 0;
        auVar12 = vfmadd231ps_fma(auVar22,auVar105,local_6a0);
        auVar16 = vfmadd231ps_fma(auVar23,auVar105,local_6c0);
        auVar92 = vfmadd231ps_fma(auVar103,local_320,auVar105);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar133,local_740);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar133,local_5c0);
        auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),local_3e0,auVar133);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar150,local_760);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar150,local_460);
        auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar150,auVar156);
        fVar125 = *(float *)(bezier_basis1 + lVar20 + 0x1f9c);
        fVar106 = *(float *)(bezier_basis1 + lVar20 + 0x1fa0);
        fVar107 = *(float *)(bezier_basis1 + lVar20 + 0x1fa4);
        fVar108 = *(float *)(bezier_basis1 + lVar20 + 0x1fa8);
        fVar109 = *(float *)(bezier_basis1 + lVar20 + 0x1fac);
        fVar110 = *(float *)(bezier_basis1 + lVar20 + 0x1fb0);
        fVar111 = *(float *)(bezier_basis1 + lVar20 + 0x1fb4);
        auVar24._4_4_ = local_680 * fVar106;
        auVar24._0_4_ = local_680 * fVar125;
        auVar24._8_4_ = local_680 * fVar107;
        auVar24._12_4_ = local_680 * fVar108;
        auVar24._16_4_ = local_680 * fVar109;
        auVar24._20_4_ = local_680 * fVar110;
        auVar24._24_4_ = local_680 * fVar111;
        auVar24._28_4_ = fVar194;
        auVar25._4_4_ = fStack_5fc * fVar106;
        auVar25._0_4_ = local_600 * fVar125;
        auVar25._8_4_ = local_600 * fVar107;
        auVar25._12_4_ = fStack_5fc * fVar108;
        auVar25._16_4_ = local_600 * fVar109;
        auVar25._20_4_ = fStack_5fc * fVar110;
        auVar25._24_4_ = local_600 * fVar111;
        auVar25._28_4_ = local_680;
        auVar26._4_4_ = fVar194 * fVar106;
        auVar26._0_4_ = fVar188 * fVar125;
        auVar26._8_4_ = fVar188 * fVar107;
        auVar26._12_4_ = fVar194 * fVar108;
        auVar26._16_4_ = fVar188 * fVar109;
        auVar26._20_4_ = fVar194 * fVar110;
        auVar26._24_4_ = fVar188 * fVar111;
        auVar26._28_4_ = fVar194;
        auVar150 = *(undefined1 (*) [32])(bezier_basis1 + lVar20 + 0x1b18);
        auVar91 = vfmadd231ps_fma(auVar24,auVar150,local_6a0);
        auVar126 = vfmadd231ps_fma(auVar25,auVar150,local_6c0);
        auVar148 = vfmadd231ps_fma(auVar26,local_320,auVar150);
        auVar150 = *(undefined1 (*) [32])(bezier_basis1 + lVar20 + 0x1694);
        auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar150,local_740);
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar150,local_5c0);
        auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),local_3e0,auVar150);
        auVar150 = *(undefined1 (*) [32])(bezier_basis1 + lVar20 + 0x1210);
        auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar150,local_760);
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar150,local_460);
        auVar119._8_4_ = 0x7fffffff;
        auVar119._0_8_ = 0x7fffffff7fffffff;
        auVar119._12_4_ = 0x7fffffff;
        auVar119._16_4_ = 0x7fffffff;
        auVar119._20_4_ = 0x7fffffff;
        auVar119._24_4_ = 0x7fffffff;
        auVar119._28_4_ = 0x7fffffff;
        auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar156,auVar150);
        auVar150 = vandps_avx(ZEXT1632(auVar12),auVar119);
        auVar133 = vandps_avx(ZEXT1632(auVar16),auVar119);
        auVar133 = vmaxps_avx(auVar150,auVar133);
        auVar150 = vandps_avx(ZEXT1632(auVar92),auVar119);
        auVar150 = vmaxps_avx(auVar133,auVar150);
        auVar134._4_4_ = local_7c0;
        auVar134._0_4_ = local_7c0;
        auVar134._8_4_ = local_7c0;
        auVar134._12_4_ = local_7c0;
        auVar134._16_4_ = local_7c0;
        auVar134._20_4_ = local_7c0;
        auVar134._24_4_ = local_7c0;
        auVar134._28_4_ = local_7c0;
        auVar150 = vcmpps_avx(auVar150,auVar134,1);
        auVar103 = vblendvps_avx(ZEXT1632(auVar12),auVar136,auVar150);
        auVar105 = vblendvps_avx(ZEXT1632(auVar16),auVar104,auVar150);
        auVar150 = vandps_avx(ZEXT1632(auVar91),auVar119);
        auVar133 = vandps_avx(ZEXT1632(auVar126),auVar119);
        auVar133 = vmaxps_avx(auVar150,auVar133);
        auVar150 = vandps_avx(ZEXT1632(auVar148),auVar119);
        auVar150 = vmaxps_avx(auVar133,auVar150);
        auVar175 = vcmpps_avx(auVar150,auVar134,1);
        auVar150 = vblendvps_avx(ZEXT1632(auVar91),auVar136,auVar175);
        auVar133 = vblendvps_avx(ZEXT1632(auVar126),auVar104,auVar175);
        auVar12 = vfmadd213ps_fma(auVar142,auVar156,ZEXT1632(auVar15));
        auVar15 = vfmadd213ps_fma(auVar103,auVar103,ZEXT832(0) << 0x20);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar105,auVar105);
        auVar142 = vrsqrtps_avx(ZEXT1632(auVar15));
        fVar125 = auVar142._0_4_;
        fVar106 = auVar142._4_4_;
        fVar107 = auVar142._8_4_;
        fVar108 = auVar142._12_4_;
        fVar109 = auVar142._16_4_;
        fVar110 = auVar142._20_4_;
        fVar111 = auVar142._24_4_;
        auVar136._4_4_ = fVar106 * fVar106 * fVar106 * auVar15._4_4_ * -0.5;
        auVar136._0_4_ = fVar125 * fVar125 * fVar125 * auVar15._0_4_ * -0.5;
        auVar136._8_4_ = fVar107 * fVar107 * fVar107 * auVar15._8_4_ * -0.5;
        auVar136._12_4_ = fVar108 * fVar108 * fVar108 * auVar15._12_4_ * -0.5;
        auVar136._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
        auVar136._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
        auVar136._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
        auVar136._28_4_ = 0;
        auVar185._8_4_ = 0x3fc00000;
        auVar185._0_8_ = 0x3fc000003fc00000;
        auVar185._12_4_ = 0x3fc00000;
        auVar185._16_4_ = 0x3fc00000;
        auVar185._20_4_ = 0x3fc00000;
        auVar185._24_4_ = 0x3fc00000;
        auVar185._28_4_ = 0x3fc00000;
        auVar15 = vfmadd231ps_fma(auVar136,auVar185,auVar142);
        fVar125 = auVar15._0_4_;
        fVar106 = auVar15._4_4_;
        auVar104._4_4_ = auVar105._4_4_ * fVar106;
        auVar104._0_4_ = auVar105._0_4_ * fVar125;
        fVar107 = auVar15._8_4_;
        auVar104._8_4_ = auVar105._8_4_ * fVar107;
        fVar108 = auVar15._12_4_;
        auVar104._12_4_ = auVar105._12_4_ * fVar108;
        auVar104._16_4_ = auVar105._16_4_ * 0.0;
        auVar104._20_4_ = auVar105._20_4_ * 0.0;
        auVar104._24_4_ = auVar105._24_4_ * 0.0;
        auVar104._28_4_ = auVar142._28_4_;
        auVar27._4_4_ = -auVar103._4_4_ * fVar106;
        auVar27._0_4_ = -auVar103._0_4_ * fVar125;
        auVar27._8_4_ = -auVar103._8_4_ * fVar107;
        auVar27._12_4_ = -auVar103._12_4_ * fVar108;
        auVar27._16_4_ = -auVar103._16_4_ * 0.0;
        auVar27._20_4_ = -auVar103._20_4_ * 0.0;
        auVar27._24_4_ = -auVar103._24_4_ * 0.0;
        auVar27._28_4_ = 0x80000000;
        auVar15 = vfmadd213ps_fma(auVar150,auVar150,ZEXT832(0) << 0x20);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar133,auVar133);
        auVar142 = vrsqrtps_avx(ZEXT1632(auVar15));
        auVar28._28_4_ = auVar175._28_4_;
        auVar28._0_28_ =
             ZEXT1628(CONCAT412(fVar108 * 0.0,
                                CONCAT48(fVar107 * 0.0,CONCAT44(fVar106 * 0.0,fVar125 * 0.0))));
        fVar125 = auVar142._0_4_;
        fVar106 = auVar142._4_4_;
        fVar107 = auVar142._8_4_;
        fVar108 = auVar142._12_4_;
        fVar109 = auVar142._16_4_;
        fVar110 = auVar142._20_4_;
        fVar111 = auVar142._24_4_;
        auVar29._4_4_ = fVar106 * fVar106 * fVar106 * auVar15._4_4_ * -0.5;
        auVar29._0_4_ = fVar125 * fVar125 * fVar125 * auVar15._0_4_ * -0.5;
        auVar29._8_4_ = fVar107 * fVar107 * fVar107 * auVar15._8_4_ * -0.5;
        auVar29._12_4_ = fVar108 * fVar108 * fVar108 * auVar15._12_4_ * -0.5;
        auVar29._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
        auVar29._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
        auVar29._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
        auVar29._28_4_ = 0;
        auVar15 = vfmadd231ps_fma(auVar29,auVar185,auVar142);
        fVar125 = auVar15._0_4_;
        fVar106 = auVar15._4_4_;
        auVar30._4_4_ = auVar133._4_4_ * fVar106;
        auVar30._0_4_ = auVar133._0_4_ * fVar125;
        fVar107 = auVar15._8_4_;
        auVar30._8_4_ = auVar133._8_4_ * fVar107;
        fVar108 = auVar15._12_4_;
        auVar30._12_4_ = auVar133._12_4_ * fVar108;
        auVar30._16_4_ = auVar133._16_4_ * 0.0;
        auVar30._20_4_ = auVar133._20_4_ * 0.0;
        auVar30._24_4_ = auVar133._24_4_ * 0.0;
        auVar30._28_4_ = auVar133._28_4_;
        auVar31._4_4_ = fVar106 * -auVar150._4_4_;
        auVar31._0_4_ = fVar125 * -auVar150._0_4_;
        auVar31._8_4_ = fVar107 * -auVar150._8_4_;
        auVar31._12_4_ = fVar108 * -auVar150._12_4_;
        auVar31._16_4_ = -auVar150._16_4_ * 0.0;
        auVar31._20_4_ = -auVar150._20_4_ * 0.0;
        auVar31._24_4_ = -auVar150._24_4_ * 0.0;
        auVar31._28_4_ = auVar103._28_4_ ^ 0x80000000;
        auVar150._28_4_ = auVar142._28_4_;
        auVar150._0_28_ =
             ZEXT1628(CONCAT412(fVar108 * 0.0,
                                CONCAT48(fVar107 * 0.0,CONCAT44(fVar106 * 0.0,fVar125 * 0.0))));
        auVar15 = vfmadd213ps_fma(auVar104,ZEXT1632(auVar13),auVar143);
        local_620 = ZEXT1632(auVar15);
        auVar133 = ZEXT1632(auVar13);
        auVar16 = vfmadd213ps_fma(auVar27,auVar133,local_340);
        local_480 = ZEXT1632(auVar16);
        auVar92 = vfmadd213ps_fma(auVar28,auVar133,ZEXT1632(auVar12));
        local_4a0 = ZEXT1632(auVar92);
        auVar148 = vfnmadd213ps_fma(auVar104,auVar133,auVar143);
        auVar91 = vfmadd213ps_fma(auVar30,ZEXT1632(auVar14),auVar96);
        auVar89 = vfnmadd213ps_fma(auVar27,auVar133,local_340);
        auVar133 = ZEXT1632(auVar14);
        auVar126 = vfmadd213ps_fma(auVar31,auVar133,auVar117);
        local_800 = ZEXT1632(auVar13);
        auVar151 = vfnmadd231ps_fma(ZEXT1632(auVar12),local_800,auVar28);
        auVar12 = vfmadd213ps_fma(auVar150,auVar133,ZEXT1632(auVar17));
        auVar114 = vfnmadd213ps_fma(auVar30,auVar133,auVar96);
        auVar147 = vfnmadd213ps_fma(auVar31,auVar133,auVar117);
        auVar152 = vfnmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar14),auVar150);
        auVar150 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar89));
        auVar133 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar151));
        auVar96._4_4_ = auVar151._4_4_ * auVar150._4_4_;
        auVar96._0_4_ = auVar151._0_4_ * auVar150._0_4_;
        auVar96._8_4_ = auVar151._8_4_ * auVar150._8_4_;
        auVar96._12_4_ = auVar151._12_4_ * auVar150._12_4_;
        auVar96._16_4_ = auVar150._16_4_ * 0.0;
        auVar96._20_4_ = auVar150._20_4_ * 0.0;
        auVar96._24_4_ = auVar150._24_4_ * 0.0;
        auVar96._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar96,ZEXT1632(auVar89),auVar133);
        auVar117._4_4_ = auVar148._4_4_ * auVar133._4_4_;
        auVar117._0_4_ = auVar148._0_4_ * auVar133._0_4_;
        auVar117._8_4_ = auVar148._8_4_ * auVar133._8_4_;
        auVar117._12_4_ = auVar148._12_4_ * auVar133._12_4_;
        auVar117._16_4_ = auVar133._16_4_ * 0.0;
        auVar117._20_4_ = auVar133._20_4_ * 0.0;
        auVar117._24_4_ = auVar133._24_4_ * 0.0;
        auVar117._28_4_ = auVar133._28_4_;
        auVar175 = ZEXT1632(auVar148);
        auVar133 = vsubps_avx(ZEXT1632(auVar91),auVar175);
        auVar17 = vfmsub231ps_fma(auVar117,ZEXT1632(auVar151),auVar133);
        auVar143._4_4_ = auVar89._4_4_ * auVar133._4_4_;
        auVar143._0_4_ = auVar89._0_4_ * auVar133._0_4_;
        auVar143._8_4_ = auVar89._8_4_ * auVar133._8_4_;
        auVar143._12_4_ = auVar89._12_4_ * auVar133._12_4_;
        auVar143._16_4_ = auVar133._16_4_ * 0.0;
        auVar143._20_4_ = auVar133._20_4_ * 0.0;
        auVar143._24_4_ = auVar133._24_4_ * 0.0;
        auVar143._28_4_ = auVar133._28_4_;
        auVar148 = vfmsub231ps_fma(auVar143,auVar175,auVar150);
        auVar150 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar150,ZEXT1632(auVar17));
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar150,ZEXT1632(auVar13));
        auVar136 = vcmpps_avx(ZEXT1632(auVar17),ZEXT1232(ZEXT812(0)) << 0x20,2);
        local_820 = vblendvps_avx(ZEXT1632(auVar114),ZEXT1632(auVar15),auVar136);
        auVar150 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar16),auVar136);
        auVar133 = vblendvps_avx(ZEXT1632(auVar152),ZEXT1632(auVar92),auVar136);
        auVar142 = vblendvps_avx(auVar175,ZEXT1632(auVar91),auVar136);
        auVar103 = vblendvps_avx(ZEXT1632(auVar89),ZEXT1632(auVar126),auVar136);
        auVar105 = vblendvps_avx(ZEXT1632(auVar151),ZEXT1632(auVar12),auVar136);
        auVar175 = vblendvps_avx(ZEXT1632(auVar91),auVar175,auVar136);
        auVar179 = vblendvps_avx(ZEXT1632(auVar126),ZEXT1632(auVar89),auVar136);
        auVar17 = vpackssdw_avx(local_380._0_16_,local_380._16_16_);
        auVar97 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar151),auVar136);
        auVar104 = vsubps_avx(auVar175,local_820);
        auVar179 = vsubps_avx(auVar179,auVar150);
        auVar182 = vsubps_avx(auVar97,auVar133);
        auVar190 = vsubps_avx(local_820,auVar142);
        auVar18 = vsubps_avx(auVar150,auVar103);
        auVar19 = vsubps_avx(auVar133,auVar105);
        auVar32._4_4_ = auVar182._4_4_ * local_820._4_4_;
        auVar32._0_4_ = auVar182._0_4_ * local_820._0_4_;
        auVar32._8_4_ = auVar182._8_4_ * local_820._8_4_;
        auVar32._12_4_ = auVar182._12_4_ * local_820._12_4_;
        auVar32._16_4_ = auVar182._16_4_ * local_820._16_4_;
        auVar32._20_4_ = auVar182._20_4_ * local_820._20_4_;
        auVar32._24_4_ = auVar182._24_4_ * local_820._24_4_;
        auVar32._28_4_ = auVar97._28_4_;
        auVar12 = vfmsub231ps_fma(auVar32,auVar133,auVar104);
        auVar33._4_4_ = auVar104._4_4_ * auVar150._4_4_;
        auVar33._0_4_ = auVar104._0_4_ * auVar150._0_4_;
        auVar33._8_4_ = auVar104._8_4_ * auVar150._8_4_;
        auVar33._12_4_ = auVar104._12_4_ * auVar150._12_4_;
        auVar33._16_4_ = auVar104._16_4_ * auVar150._16_4_;
        auVar33._20_4_ = auVar104._20_4_ * auVar150._20_4_;
        auVar33._24_4_ = auVar104._24_4_ * auVar150._24_4_;
        auVar33._28_4_ = auVar175._28_4_;
        auVar13 = vfmsub231ps_fma(auVar33,local_820,auVar179);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar100._0_4_ = auVar179._0_4_ * auVar133._0_4_;
        auVar100._4_4_ = auVar179._4_4_ * auVar133._4_4_;
        auVar100._8_4_ = auVar179._8_4_ * auVar133._8_4_;
        auVar100._12_4_ = auVar179._12_4_ * auVar133._12_4_;
        auVar100._16_4_ = auVar179._16_4_ * auVar133._16_4_;
        auVar100._20_4_ = auVar179._20_4_ * auVar133._20_4_;
        auVar100._24_4_ = auVar179._24_4_ * auVar133._24_4_;
        auVar100._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar100,auVar150,auVar182);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar101._0_4_ = auVar19._0_4_ * auVar142._0_4_;
        auVar101._4_4_ = auVar19._4_4_ * auVar142._4_4_;
        auVar101._8_4_ = auVar19._8_4_ * auVar142._8_4_;
        auVar101._12_4_ = auVar19._12_4_ * auVar142._12_4_;
        auVar101._16_4_ = auVar19._16_4_ * auVar142._16_4_;
        auVar101._20_4_ = auVar19._20_4_ * auVar142._20_4_;
        auVar101._24_4_ = auVar19._24_4_ * auVar142._24_4_;
        auVar101._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar101,auVar190,auVar105);
        auVar34._4_4_ = auVar18._4_4_ * auVar105._4_4_;
        auVar34._0_4_ = auVar18._0_4_ * auVar105._0_4_;
        auVar34._8_4_ = auVar18._8_4_ * auVar105._8_4_;
        auVar34._12_4_ = auVar18._12_4_ * auVar105._12_4_;
        auVar34._16_4_ = auVar18._16_4_ * auVar105._16_4_;
        auVar34._20_4_ = auVar18._20_4_ * auVar105._20_4_;
        auVar34._24_4_ = auVar18._24_4_ * auVar105._24_4_;
        auVar34._28_4_ = auVar105._28_4_;
        auVar15 = vfmsub231ps_fma(auVar34,auVar103,auVar19);
        auVar35._4_4_ = auVar190._4_4_ * auVar103._4_4_;
        auVar35._0_4_ = auVar190._0_4_ * auVar103._0_4_;
        auVar35._8_4_ = auVar190._8_4_ * auVar103._8_4_;
        auVar35._12_4_ = auVar190._12_4_ * auVar103._12_4_;
        auVar35._16_4_ = auVar190._16_4_ * auVar103._16_4_;
        auVar35._20_4_ = auVar190._20_4_ * auVar103._20_4_;
        auVar35._24_4_ = auVar190._24_4_ * auVar103._24_4_;
        auVar35._28_4_ = auVar103._28_4_;
        auVar16 = vfmsub231ps_fma(auVar35,auVar18,auVar142);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar142 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar15));
        auVar142 = vcmpps_avx(auVar142,ZEXT832(0) << 0x20,2);
        auVar12 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
        auVar17 = vpand_avx(auVar12,auVar17);
        auVar142 = vpmovsxwd_avx2(auVar17);
        if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar142 >> 0x7f,0) == '\0') &&
              (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar142 >> 0xbf,0) == '\0') &&
            (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar142[0x1f]) {
LAB_0169c0f7:
          auVar124 = ZEXT3264(CONCAT824(uStack_4a8,
                                        CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
          auVar187 = ZEXT3264(local_500);
          auVar146 = ZEXT3264(local_520);
        }
        else {
          auVar36._4_4_ = auVar179._4_4_ * auVar19._4_4_;
          auVar36._0_4_ = auVar179._0_4_ * auVar19._0_4_;
          auVar36._8_4_ = auVar179._8_4_ * auVar19._8_4_;
          auVar36._12_4_ = auVar179._12_4_ * auVar19._12_4_;
          auVar36._16_4_ = auVar179._16_4_ * auVar19._16_4_;
          auVar36._20_4_ = auVar179._20_4_ * auVar19._20_4_;
          auVar36._24_4_ = auVar179._24_4_ * auVar19._24_4_;
          auVar36._28_4_ = auVar142._28_4_;
          auVar91 = vfmsub231ps_fma(auVar36,auVar18,auVar182);
          auVar120._0_4_ = auVar190._0_4_ * auVar182._0_4_;
          auVar120._4_4_ = auVar190._4_4_ * auVar182._4_4_;
          auVar120._8_4_ = auVar190._8_4_ * auVar182._8_4_;
          auVar120._12_4_ = auVar190._12_4_ * auVar182._12_4_;
          auVar120._16_4_ = auVar190._16_4_ * auVar182._16_4_;
          auVar120._20_4_ = auVar190._20_4_ * auVar182._20_4_;
          auVar120._24_4_ = auVar190._24_4_ * auVar182._24_4_;
          auVar120._28_4_ = 0;
          auVar92 = vfmsub231ps_fma(auVar120,auVar104,auVar19);
          auVar37._4_4_ = auVar104._4_4_ * auVar18._4_4_;
          auVar37._0_4_ = auVar104._0_4_ * auVar18._0_4_;
          auVar37._8_4_ = auVar104._8_4_ * auVar18._8_4_;
          auVar37._12_4_ = auVar104._12_4_ * auVar18._12_4_;
          auVar37._16_4_ = auVar104._16_4_ * auVar18._16_4_;
          auVar37._20_4_ = auVar104._20_4_ * auVar18._20_4_;
          auVar37._24_4_ = auVar104._24_4_ * auVar18._24_4_;
          auVar37._28_4_ = auVar104._28_4_;
          auVar126 = vfmsub231ps_fma(auVar37,auVar190,auVar179);
          auVar12 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar92),ZEXT1632(auVar126));
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar91),_DAT_02020f00);
          auVar142 = vrcpps_avx(ZEXT1632(auVar16));
          auVar186._8_4_ = 0x3f800000;
          auVar186._0_8_ = &DAT_3f8000003f800000;
          auVar186._12_4_ = 0x3f800000;
          auVar186._16_4_ = 0x3f800000;
          auVar186._20_4_ = 0x3f800000;
          auVar186._24_4_ = 0x3f800000;
          auVar186._28_4_ = 0x3f800000;
          auVar12 = vfnmadd213ps_fma(auVar142,ZEXT1632(auVar16),auVar186);
          auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar142,auVar142);
          auVar157._0_4_ = auVar133._0_4_ * auVar126._0_4_;
          auVar157._4_4_ = auVar133._4_4_ * auVar126._4_4_;
          auVar157._8_4_ = auVar133._8_4_ * auVar126._8_4_;
          auVar157._12_4_ = auVar133._12_4_ * auVar126._12_4_;
          auVar157._16_4_ = auVar133._16_4_ * 0.0;
          auVar157._20_4_ = auVar133._20_4_ * 0.0;
          auVar157._24_4_ = auVar133._24_4_ * 0.0;
          auVar157._28_4_ = 0;
          auVar92 = vfmadd231ps_fma(auVar157,auVar150,ZEXT1632(auVar92));
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT1632(auVar91),local_820);
          fVar106 = auVar12._0_4_;
          fVar107 = auVar12._4_4_;
          fVar108 = auVar12._8_4_;
          fVar109 = auVar12._12_4_;
          auVar142 = ZEXT1632(CONCAT412(fVar109 * auVar92._12_4_,
                                        CONCAT48(fVar108 * auVar92._8_4_,
                                                 CONCAT44(fVar107 * auVar92._4_4_,
                                                          fVar106 * auVar92._0_4_))));
          auVar102._4_4_ = uVar85;
          auVar102._0_4_ = uVar85;
          auVar102._8_4_ = uVar85;
          auVar102._12_4_ = uVar85;
          auVar102._16_4_ = uVar85;
          auVar102._20_4_ = uVar85;
          auVar102._24_4_ = uVar85;
          auVar102._28_4_ = uVar85;
          fVar125 = ray->tfar;
          auVar121._4_4_ = fVar125;
          auVar121._0_4_ = fVar125;
          auVar121._8_4_ = fVar125;
          auVar121._12_4_ = fVar125;
          auVar121._16_4_ = fVar125;
          auVar121._20_4_ = fVar125;
          auVar121._24_4_ = fVar125;
          auVar121._28_4_ = fVar125;
          auVar150 = vcmpps_avx(auVar102,auVar142,2);
          auVar133 = vcmpps_avx(auVar142,auVar121,2);
          auVar150 = vandps_avx(auVar133,auVar150);
          auVar12 = vpackssdw_avx(auVar150._0_16_,auVar150._16_16_);
          auVar17 = vpand_avx(auVar17,auVar12);
          auVar150 = vpmovsxwd_avx2(auVar17);
          if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar150 >> 0x7f,0) == '\0') &&
                (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar150 >> 0xbf,0) == '\0') &&
              (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar150[0x1f]) goto LAB_0169c0f7;
          auVar150 = vcmpps_avx(ZEXT1632(auVar16),ZEXT832(0) << 0x20,4);
          auVar12 = vpackssdw_avx(auVar150._0_16_,auVar150._16_16_);
          auVar17 = vpand_avx(auVar17,auVar12);
          auVar150 = vpmovsxwd_avx2(auVar17);
          auVar124 = ZEXT3264(CONCAT824(uStack_4a8,
                                        CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
          auVar187 = ZEXT3264(local_500);
          auVar146 = ZEXT3264(local_520);
          if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar150 >> 0x7f,0) != '\0') ||
                (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar150 >> 0xbf,0) != '\0') ||
              (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar150[0x1f] < '\0') {
            auVar103 = ZEXT1632(CONCAT412(fVar109 * auVar13._12_4_,
                                          CONCAT48(fVar108 * auVar13._8_4_,
                                                   CONCAT44(fVar107 * auVar13._4_4_,
                                                            fVar106 * auVar13._0_4_))));
            auVar105 = ZEXT1632(CONCAT412(fVar109 * auVar15._12_4_,
                                          CONCAT48(fVar108 * auVar15._8_4_,
                                                   CONCAT44(fVar107 * auVar15._4_4_,
                                                            fVar106 * auVar15._0_4_))));
            auVar149._8_4_ = 0x3f800000;
            auVar149._0_8_ = &DAT_3f8000003f800000;
            auVar149._12_4_ = 0x3f800000;
            auVar149._16_4_ = 0x3f800000;
            auVar149._20_4_ = 0x3f800000;
            auVar149._24_4_ = 0x3f800000;
            auVar149._28_4_ = 0x3f800000;
            auVar133 = vsubps_avx(auVar149,auVar103);
            auVar133 = vblendvps_avx(auVar133,auVar103,auVar136);
            auVar187 = ZEXT3264(auVar133);
            auVar133 = vsubps_avx(auVar149,auVar105);
            local_3a0 = vblendvps_avx(auVar133,auVar105,auVar136);
            auVar124 = ZEXT3264(auVar150);
            auVar146 = ZEXT3264(auVar142);
          }
        }
        auVar206 = ZEXT3264(local_760);
        auVar199 = ZEXT3264(local_740);
        auVar192 = ZEXT3264(_local_580);
        auVar183 = ZEXT3264(local_6a0);
        local_500 = auVar187._0_32_;
        local_520 = auVar146._0_32_;
        auVar150 = auVar124._0_32_;
        if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar150 >> 0x7f,0) == '\0') &&
              (auVar124 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar150 >> 0xbf,0) == '\0') &&
            (auVar124 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar124[0x1f]) {
          auVar163 = ZEXT3264(CONCAT428(fStack_5fc,
                                        CONCAT424(local_600,
                                                  CONCAT420(fStack_5fc,
                                                            CONCAT416(local_600,
                                                                      CONCAT412(fStack_5fc,
                                                                                CONCAT48(local_600,
                                                                                         uVar88)))))
                                       ));
          auVar173 = ZEXT3264(CONCAT428(local_680,
                                        CONCAT424(local_680,
                                                  CONCAT420(local_680,
                                                            CONCAT416(local_680,
                                                                      CONCAT412(local_680,
                                                                                CONCAT48(local_680,
                                                                                         CONCAT44(
                                                  local_680,local_680))))))));
        }
        else {
          auVar133 = vsubps_avx(ZEXT1632(auVar14),local_800);
          auVar17 = vfmadd213ps_fma(auVar133,local_500,local_800);
          fVar125 = local_788->depth_scale;
          auVar38._4_4_ = (auVar17._4_4_ + auVar17._4_4_) * fVar125;
          auVar38._0_4_ = (auVar17._0_4_ + auVar17._0_4_) * fVar125;
          auVar38._8_4_ = (auVar17._8_4_ + auVar17._8_4_) * fVar125;
          auVar38._12_4_ = (auVar17._12_4_ + auVar17._12_4_) * fVar125;
          auVar38._16_4_ = fVar125 * 0.0;
          auVar38._20_4_ = fVar125 * 0.0;
          auVar38._24_4_ = fVar125 * 0.0;
          auVar38._28_4_ = 0;
          auVar133 = vcmpps_avx(local_520,auVar38,6);
          auVar142 = auVar150 & auVar133;
          auVar163 = ZEXT3264(CONCAT428(fStack_5fc,
                                        CONCAT424(local_600,
                                                  CONCAT420(fStack_5fc,
                                                            CONCAT416(local_600,
                                                                      CONCAT412(fStack_5fc,
                                                                                CONCAT48(local_600,
                                                                                         uVar88)))))
                                       ));
          auVar173 = ZEXT3264(CONCAT428(local_680,
                                        CONCAT424(local_680,
                                                  CONCAT420(local_680,
                                                            CONCAT416(local_680,
                                                                      CONCAT412(local_680,
                                                                                CONCAT48(local_680,
                                                                                         CONCAT44(
                                                  local_680,local_680))))))));
          auVar124 = ZEXT3264(auVar156);
          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar142 >> 0x7f,0) != '\0') ||
                (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar142 >> 0xbf,0) != '\0') ||
              (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar142[0x1f] < '\0') {
            local_220 = vandps_avx(auVar133,auVar150);
            auVar122._8_4_ = 0xbf800000;
            auVar122._0_8_ = 0xbf800000bf800000;
            auVar122._12_4_ = 0xbf800000;
            auVar122._16_4_ = 0xbf800000;
            auVar122._20_4_ = 0xbf800000;
            auVar122._24_4_ = 0xbf800000;
            auVar122._28_4_ = 0xbf800000;
            auVar135._8_4_ = 0x40000000;
            auVar135._0_8_ = 0x4000000040000000;
            auVar135._12_4_ = 0x40000000;
            auVar135._16_4_ = 0x40000000;
            auVar135._20_4_ = 0x40000000;
            auVar135._24_4_ = 0x40000000;
            auVar135._28_4_ = 0x40000000;
            auVar17 = vfmadd213ps_fma(local_3a0,auVar135,auVar122);
            local_2e0 = local_500;
            local_2c0 = ZEXT1632(auVar17);
            local_2a0 = local_520;
            local_280 = 0;
            local_27c = iVar8;
            local_270 = local_590._0_8_;
            uStack_268 = local_590._8_8_;
            local_260 = local_4d0._0_8_;
            uStack_258 = local_4d0._8_8_;
            local_250 = local_4e0._0_8_;
            uStack_248 = local_4e0._8_8_;
            local_240 = local_430._0_8_;
            uStack_238 = local_430._8_8_;
            local_3a0 = ZEXT1632(auVar17);
            auVar150 = local_3a0;
            local_590 = auVar115;
            if ((pGVar9->mask & ray->mask) == 0) {
              bVar87 = false;
              local_4e0 = auVar90;
              local_4d0 = auVar116;
              local_430 = auVar138;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar87 = true, local_4e0 = auVar90, local_4d0 = auVar116, local_430 = auVar138,
                    pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar125 = 1.0 / (float)local_400._0_4_;
              local_200[0] = fVar125 * (auVar187._0_4_ + 0.0);
              local_200[1] = fVar125 * (auVar187._4_4_ + 1.0);
              local_200[2] = fVar125 * (auVar187._8_4_ + 2.0);
              local_200[3] = fVar125 * (auVar187._12_4_ + 3.0);
              fStack_1f0 = fVar125 * (auVar187._16_4_ + 4.0);
              fStack_1ec = fVar125 * (auVar187._20_4_ + 5.0);
              fStack_1e8 = fVar125 * (auVar187._24_4_ + 6.0);
              fStack_1e4 = auVar187._28_4_ + 7.0;
              local_3a0._0_8_ = auVar17._0_8_;
              local_3a0._8_8_ = auVar17._8_8_;
              local_1e0 = local_3a0._0_8_;
              uStack_1d8 = local_3a0._8_8_;
              uStack_1d0 = 0;
              uStack_1c8 = 0;
              local_1c0 = local_520;
              uVar85 = vmovmskps_avx(local_220);
              bVar87 = uVar85 != 0;
              auVar133 = local_520;
              local_4e0 = auVar90;
              local_4d0 = auVar116;
              local_430 = auVar138;
              local_3a0 = auVar150;
              auVar150 = local_500;
              if (bVar87) {
                lVar83 = 0;
                uVar84 = (ulong)(uVar85 & 0xff);
                for (uVar82 = uVar84; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000)
                {
                  lVar83 = lVar83 + 1;
                }
                local_5e0 = ZEXT1632(local_4d0);
                local_540 = ZEXT1632(local_4e0);
                _local_560 = ZEXT1632(local_430);
                local_7c8 = prim;
                local_830 = context;
                local_828 = ray;
                _local_360 = auVar118;
                do {
                  local_654 = local_200[lVar83];
                  local_650 = *(undefined4 *)((long)&local_1e0 + lVar83 * 4);
                  local_620._0_4_ = ray->tfar;
                  local_800._0_8_ = lVar83;
                  ray->tfar = *(float *)(local_1c0 + lVar83 * 4);
                  local_6f0.context = context->user;
                  fVar106 = 1.0 - local_654;
                  fVar125 = fVar106 * fVar106 * -3.0;
                  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar106 * fVar106)),
                                            ZEXT416((uint)(local_654 * fVar106)),ZEXT416(0xc0000000)
                                           );
                  auVar12 = vfmsub132ss_fma(ZEXT416((uint)(local_654 * fVar106)),
                                            ZEXT416((uint)(local_654 * local_654)),
                                            ZEXT416(0x40000000));
                  fVar106 = auVar17._0_4_ * 3.0;
                  fVar107 = auVar12._0_4_ * 3.0;
                  fVar108 = local_654 * local_654 * 3.0;
                  auVar154._0_4_ = fVar108 * (float)local_560._0_4_;
                  auVar154._4_4_ = fVar108 * (float)local_560._4_4_;
                  auVar154._8_4_ = fVar108 * fStack_558;
                  auVar154._12_4_ = fVar108 * fStack_554;
                  auVar129._4_4_ = fVar107;
                  auVar129._0_4_ = fVar107;
                  auVar129._8_4_ = fVar107;
                  auVar129._12_4_ = fVar107;
                  auVar17 = vfmadd132ps_fma(auVar129,auVar154,local_540._0_16_);
                  auVar124 = ZEXT3264(auVar124._0_32_);
                  auVar140._4_4_ = fVar106;
                  auVar140._0_4_ = fVar106;
                  auVar140._8_4_ = fVar106;
                  auVar140._12_4_ = fVar106;
                  auVar17 = vfmadd132ps_fma(auVar140,auVar17,local_5e0._0_16_);
                  auVar130._4_4_ = fVar125;
                  auVar130._0_4_ = fVar125;
                  auVar130._8_4_ = fVar125;
                  auVar130._12_4_ = fVar125;
                  auVar17 = vfmadd132ps_fma(auVar130,auVar17,local_590);
                  local_660 = vmovlps_avx(auVar17);
                  local_658 = vextractps_avx(auVar17,2);
                  local_64c = (int)local_628;
                  local_648 = (int)local_790;
                  local_644 = (local_6f0.context)->instID[0];
                  local_640 = (local_6f0.context)->instPrimID[0];
                  local_834 = -1;
                  local_6f0.valid = &local_834;
                  local_6f0.geometryUserPtr = pGVar9->userPtr;
                  local_6f0.ray = (RTCRayN *)ray;
                  local_6f0.hit = (RTCHitN *)&local_660;
                  local_6f0.N = 1;
                  local_820._0_8_ = uVar84;
                  if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0169b276:
                    auVar156 = auVar124._0_32_;
                    p_Var11 = context->args->filter;
                    auVar133 = auVar146._0_32_;
                    auVar150 = auVar187._0_32_;
                    if (p_Var11 == (RTCFilterFunctionN)0x0) break;
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                      (*p_Var11)(&local_6f0);
                      auVar192 = ZEXT3264(_local_580);
                      auVar124 = ZEXT3264(local_720);
                      auVar206 = ZEXT3264(local_760);
                      auVar199 = ZEXT3264(local_740);
                      auVar173 = ZEXT3264(CONCAT428(fStack_664,
                                                    CONCAT424(fStack_668,
                                                              CONCAT420(fStack_66c,
                                                                        CONCAT416(fStack_670,
                                                                                  CONCAT412(
                                                  fStack_674,
                                                  CONCAT48(fStack_678,CONCAT44(fStack_67c,local_680)
                                                          )))))));
                      auVar183 = ZEXT3264(local_6a0);
                      auVar146 = ZEXT3264(local_520);
                      auVar187 = ZEXT3264(local_500);
                      ray = local_828;
                      uVar84 = local_820._0_8_;
                      prim = local_7c8;
                      context = local_830;
                    }
                    auVar156 = auVar124._0_32_;
                    auVar133 = auVar146._0_32_;
                    auVar150 = auVar187._0_32_;
                    if (*local_6f0.valid != 0) break;
                  }
                  else {
                    (*pGVar9->occlusionFilterN)(&local_6f0);
                    auVar192 = ZEXT3264(_local_580);
                    auVar124 = ZEXT3264(local_720);
                    auVar206 = ZEXT3264(local_760);
                    auVar199 = ZEXT3264(local_740);
                    auVar173 = ZEXT3264(CONCAT428(fStack_664,
                                                  CONCAT424(fStack_668,
                                                            CONCAT420(fStack_66c,
                                                                      CONCAT416(fStack_670,
                                                                                CONCAT412(fStack_674
                                                                                          ,CONCAT48(
                                                  fStack_678,CONCAT44(fStack_67c,local_680))))))));
                    auVar183 = ZEXT3264(local_6a0);
                    auVar146 = ZEXT3264(local_520);
                    auVar187 = ZEXT3264(local_500);
                    ray = local_828;
                    uVar84 = local_820._0_8_;
                    prim = local_7c8;
                    context = local_830;
                    if (*local_6f0.valid != 0) goto LAB_0169b276;
                  }
                  auVar156 = auVar124._0_32_;
                  ray->tfar = (float)local_620._0_4_;
                  lVar83 = 0;
                  uVar84 = uVar84 ^ 1L << (local_800._0_8_ & 0x3f);
                  for (uVar82 = uVar84; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000
                      ) {
                    lVar83 = lVar83 + 1;
                  }
                  bVar87 = uVar84 != 0;
                  auVar133 = auVar146._0_32_;
                  auVar150 = auVar187._0_32_;
                } while (bVar87);
              }
              local_500 = auVar150;
              local_520 = auVar133;
              auVar163 = ZEXT3264(CONCAT428(fStack_5e4,
                                            CONCAT424(fStack_5e8,
                                                      CONCAT420(fStack_5ec,
                                                                CONCAT416(fStack_5f0,
                                                                          CONCAT412(fStack_5f4,
                                                                                    CONCAT48(
                                                  fStack_5f8,CONCAT44(fStack_5fc,local_600))))))));
            }
            auVar124 = ZEXT3264(local_6c0);
            goto LAB_0169ae93;
          }
        }
        bVar87 = false;
        auVar124 = ZEXT3264(local_6c0);
      }
LAB_0169ae93:
      local_828 = ray;
      local_7c8 = prim;
      local_830 = context;
      if (8 < iVar8) {
        local_720 = auVar156;
        local_380._4_4_ = iVar8;
        local_380._0_4_ = iVar8;
        local_380._8_4_ = iVar8;
        local_380._12_4_ = iVar8;
        local_380._16_4_ = iVar8;
        local_380._20_4_ = iVar8;
        local_380._24_4_ = iVar8;
        local_380._28_4_ = iVar8;
        local_e0 = local_7c0;
        fStack_dc = local_7c0;
        fStack_d8 = local_7c0;
        fStack_d4 = local_7c0;
        fStack_d0 = local_7c0;
        fStack_cc = local_7c0;
        fStack_c8 = local_7c0;
        fStack_c4 = local_7c0;
        local_100 = local_780._0_4_;
        uStack_fc = local_780._0_4_;
        uStack_f8 = local_780._0_4_;
        uStack_f4 = local_780._0_4_;
        uStack_f0 = local_780._0_4_;
        uStack_ec = local_780._0_4_;
        uStack_e8 = local_780._0_4_;
        uStack_e4 = local_780._0_4_;
        local_120 = 1.0 / (float)local_400._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        lVar83 = 8;
        auVar146 = ZEXT3264(local_5c0);
        _local_580 = auVar192._0_32_;
        do {
          auVar150 = *(undefined1 (*) [32])(bezier_basis0 + lVar83 * 4 + lVar20);
          local_780 = *(undefined1 (*) [32])(lVar20 + 0x2227768 + lVar83 * 4);
          auVar133 = *(undefined1 (*) [32])(lVar20 + 0x2227bec + lVar83 * 4);
          pauVar1 = (undefined1 (*) [32])(lVar20 + 0x2228070 + lVar83 * 4);
          fStack_7b0 = *(float *)(*pauVar1 + 0x10);
          fStack_7ac = *(float *)(*pauVar1 + 0x14);
          fStack_7a8 = *(float *)(*pauVar1 + 0x18);
          auVar78 = *(undefined1 (*) [28])*pauVar1;
          uStack_7a4 = *(undefined4 *)(*pauVar1 + 0x1c);
          auVar193._0_4_ = auVar173._0_4_ * *(float *)*pauVar1;
          auVar193._4_4_ = auVar173._4_4_ * *(float *)(*pauVar1 + 4);
          auVar193._8_4_ = auVar173._8_4_ * *(float *)(*pauVar1 + 8);
          auVar193._12_4_ = auVar173._12_4_ * *(float *)(*pauVar1 + 0xc);
          auVar193._16_4_ = auVar173._16_4_ * fStack_7b0;
          auVar193._20_4_ = auVar173._20_4_ * fStack_7ac;
          auVar193._28_36_ = auVar192._28_36_;
          auVar193._24_4_ = auVar173._24_4_ * fStack_7a8;
          auVar39._4_4_ = auVar163._4_4_ * *(float *)(*pauVar1 + 4);
          auVar39._0_4_ = auVar163._0_4_ * *(float *)*pauVar1;
          auVar39._8_4_ = auVar163._8_4_ * *(float *)(*pauVar1 + 8);
          auVar39._12_4_ = auVar163._12_4_ * *(float *)(*pauVar1 + 0xc);
          auVar39._16_4_ = auVar163._16_4_ * fStack_7b0;
          auVar39._20_4_ = auVar163._20_4_ * fStack_7ac;
          auVar39._24_4_ = auVar163._24_4_ * fStack_7a8;
          auVar39._28_4_ = uStack_7a4;
          auVar182 = auVar183._0_32_;
          auVar17 = vfmadd231ps_fma(auVar193._0_32_,auVar133,auVar182);
          auVar12 = vfmadd231ps_fma(auVar39,auVar133,auVar124._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_780,auVar199._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_780,auVar146._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar150,auVar206._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar150,local_460);
          auVar179 = *(undefined1 (*) [32])(bezier_basis1 + lVar83 * 4 + lVar20);
          local_480 = *(undefined1 (*) [32])(lVar20 + 0x2229b88 + lVar83 * 4);
          auVar142 = *(undefined1 (*) [32])(lVar20 + 0x222a00c + lVar83 * 4);
          pauVar2 = (undefined1 (*) [16])(lVar20 + 0x222a490 + lVar83 * 4);
          fVar188 = *(float *)*pauVar2;
          fVar69 = *(float *)(*pauVar2 + 4);
          fVar70 = *(float *)(*pauVar2 + 8);
          auVar79 = *(undefined1 (*) [12])*pauVar2;
          fVar71 = *(float *)(*pauVar2 + 0xc);
          fStack_3f0 = *(float *)pauVar2[1];
          fStack_3ec = *(float *)(pauVar2[1] + 4);
          fStack_3e8 = *(float *)(pauVar2[1] + 8);
          auVar187._0_4_ = auVar173._0_4_ * fVar188;
          auVar187._4_4_ = auVar173._4_4_ * fVar69;
          auVar187._8_4_ = auVar173._8_4_ * fVar70;
          auVar187._12_4_ = auVar173._12_4_ * fVar71;
          auVar187._16_4_ = auVar173._16_4_ * fStack_3f0;
          auVar187._20_4_ = auVar173._20_4_ * fStack_3ec;
          auVar187._28_36_ = auVar173._28_36_;
          auVar187._24_4_ = auVar173._24_4_ * fStack_3e8;
          auVar192._0_4_ = fVar188 * auVar163._0_4_;
          auVar192._4_4_ = fVar69 * auVar163._4_4_;
          auVar192._8_4_ = fVar70 * auVar163._8_4_;
          auVar192._12_4_ = fVar71 * auVar163._12_4_;
          auVar192._16_4_ = fStack_3f0 * auVar163._16_4_;
          auVar192._20_4_ = fStack_3ec * auVar163._20_4_;
          auVar192._28_36_ = auVar146._28_36_;
          auVar192._24_4_ = fStack_3e8 * auVar163._24_4_;
          auVar13 = vfmadd231ps_fma(auVar187._0_32_,auVar142,auVar182);
          auVar14 = vfmadd231ps_fma(auVar192._0_32_,auVar142,auVar124._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_480,auVar199._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_480,auVar146._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar179,auVar206._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar179,local_460);
          local_340 = ZEXT1632(auVar13);
          auVar190 = ZEXT1632(auVar17);
          local_4a0 = vsubps_avx(local_340,auVar190);
          auVar104 = ZEXT1632(auVar14);
          auVar136 = ZEXT1632(auVar12);
          _local_360 = vsubps_avx(auVar104,auVar136);
          auVar68._4_4_ = local_4a0._4_4_ * auVar12._4_4_;
          auVar68._0_4_ = local_4a0._0_4_ * auVar12._0_4_;
          auVar68._8_4_ = local_4a0._8_4_ * auVar12._8_4_;
          auVar68._12_4_ = local_4a0._12_4_ * auVar12._12_4_;
          auVar68._16_4_ = local_4a0._16_4_ * 0.0;
          auVar68._20_4_ = local_4a0._20_4_ * 0.0;
          auVar68._24_4_ = local_4a0._24_4_ * 0.0;
          auVar68._28_4_ = local_460._28_4_;
          fVar125 = local_360._0_4_;
          auVar146._0_4_ = auVar17._0_4_ * fVar125;
          fVar106 = local_360._4_4_;
          auVar146._4_4_ = auVar17._4_4_ * fVar106;
          fVar107 = local_360._8_4_;
          auVar146._8_4_ = auVar17._8_4_ * fVar107;
          fVar108 = local_360._12_4_;
          auVar146._12_4_ = auVar17._12_4_ * fVar108;
          fVar109 = local_360._16_4_;
          auVar146._16_4_ = fVar109 * 0.0;
          fVar110 = local_360._20_4_;
          auVar146._20_4_ = fVar110 * 0.0;
          fVar111 = local_360._24_4_;
          auVar146._28_36_ = auVar124._28_36_;
          auVar146._24_4_ = fVar111 * 0.0;
          auVar192 = ZEXT3264(*pauVar1);
          auVar105 = vsubps_avx(auVar68,auVar146._0_32_);
          auVar124._0_4_ = auVar78._0_4_ * (float)local_160._0_4_;
          auVar124._4_4_ = auVar78._4_4_ * (float)local_160._4_4_;
          auVar124._8_4_ = auVar78._8_4_ * fStack_158;
          auVar124._12_4_ = auVar78._12_4_ * fStack_154;
          auVar124._16_4_ = auVar78._16_4_ * fStack_150;
          auVar124._20_4_ = auVar78._20_4_ * fStack_14c;
          auVar124._28_36_ = auVar163._28_36_;
          auVar124._24_4_ = auVar78._24_4_ * fStack_148;
          auVar17 = vfmadd231ps_fma(auVar124._0_32_,auVar133,local_a0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_780,local_80);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_140,auVar150);
          _local_400 = *pauVar2;
          auVar14 = _local_400;
          uStack_3e4 = *(undefined4 *)(pauVar2[1] + 0xc);
          auVar40._4_4_ = fVar69 * (float)local_160._4_4_;
          auVar40._0_4_ = fVar188 * (float)local_160._0_4_;
          auVar40._8_4_ = fVar70 * fStack_158;
          auVar40._12_4_ = fVar71 * fStack_154;
          auVar40._16_4_ = fStack_3f0 * fStack_150;
          auVar40._20_4_ = fStack_3ec * fStack_14c;
          auVar40._24_4_ = fStack_3e8 * fStack_148;
          auVar40._28_4_ = uStack_144;
          auVar12 = vfmadd231ps_fma(auVar40,auVar142,local_a0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_480,local_80);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar179,local_140);
          auVar41._4_4_ = fVar106 * fVar106;
          auVar41._0_4_ = fVar125 * fVar125;
          auVar41._8_4_ = fVar107 * fVar107;
          auVar41._12_4_ = fVar108 * fVar108;
          auVar41._16_4_ = fVar109 * fVar109;
          auVar41._20_4_ = fVar110 * fVar110;
          auVar41._24_4_ = fVar111 * fVar111;
          auVar41._28_4_ = local_140._28_4_;
          auVar13 = vfmadd231ps_fma(auVar41,local_4a0,local_4a0);
          auVar97 = ZEXT1632(auVar12);
          auVar103 = vmaxps_avx(ZEXT1632(auVar17),auVar97);
          auVar176._0_4_ = auVar103._0_4_ * auVar103._0_4_ * auVar13._0_4_;
          auVar176._4_4_ = auVar103._4_4_ * auVar103._4_4_ * auVar13._4_4_;
          auVar176._8_4_ = auVar103._8_4_ * auVar103._8_4_ * auVar13._8_4_;
          auVar176._12_4_ = auVar103._12_4_ * auVar103._12_4_ * auVar13._12_4_;
          auVar176._16_4_ = auVar103._16_4_ * auVar103._16_4_ * 0.0;
          auVar176._20_4_ = auVar103._20_4_ * auVar103._20_4_ * 0.0;
          auVar176._24_4_ = auVar103._24_4_ * auVar103._24_4_ * 0.0;
          auVar176._28_4_ = 0;
          auVar42._4_4_ = auVar105._4_4_ * auVar105._4_4_;
          auVar42._0_4_ = auVar105._0_4_ * auVar105._0_4_;
          auVar42._8_4_ = auVar105._8_4_ * auVar105._8_4_;
          auVar42._12_4_ = auVar105._12_4_ * auVar105._12_4_;
          auVar42._16_4_ = auVar105._16_4_ * auVar105._16_4_;
          auVar42._20_4_ = auVar105._20_4_ * auVar105._20_4_;
          auVar42._24_4_ = auVar105._24_4_ * auVar105._24_4_;
          auVar42._28_4_ = auVar105._28_4_;
          auVar103 = vcmpps_avx(auVar42,auVar176,2);
          local_280 = (int)lVar83;
          auVar177._4_4_ = local_280;
          auVar177._0_4_ = local_280;
          auVar177._8_4_ = local_280;
          auVar177._12_4_ = local_280;
          auVar177._16_4_ = local_280;
          auVar177._20_4_ = local_280;
          auVar177._24_4_ = local_280;
          auVar177._28_4_ = local_280;
          auVar105 = vpor_avx2(auVar177,_DAT_0205a920);
          auVar175 = vpcmpgtd_avx2(local_380,auVar105);
          auVar105 = auVar175 & auVar103;
          if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar105 >> 0x7f,0) == '\0') &&
                (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar105 >> 0xbf,0) == '\0') &&
              (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar105[0x1f]) {
            auVar146 = ZEXT3264(local_5c0);
            auVar124 = ZEXT3264(local_6c0);
            auVar163 = ZEXT3264(CONCAT428(fStack_5e4,
                                          CONCAT424(fStack_5e8,
                                                    CONCAT420(fStack_5ec,
                                                              CONCAT416(fStack_5f0,
                                                                        CONCAT412(fStack_5f4,
                                                                                  CONCAT48(
                                                  fStack_5f8,CONCAT44(fStack_5fc,local_600))))))));
            auVar183 = ZEXT3264(auVar182);
            auVar173 = ZEXT3264(CONCAT428(fStack_664,
                                          CONCAT424(fStack_668,
                                                    CONCAT420(fStack_66c,
                                                              CONCAT416(fStack_670,
                                                                        CONCAT412(fStack_674,
                                                                                  CONCAT48(
                                                  fStack_678,CONCAT44(fStack_67c,local_680))))))));
            auVar199 = ZEXT3264(local_740);
            auVar206 = ZEXT3264(local_760);
          }
          else {
            local_c0 = vandps_avx(auVar175,auVar103);
            local_400._0_4_ = auVar79._0_4_;
            local_400._4_4_ = auVar79._4_4_;
            fStack_3f8 = auVar79._8_4_;
            auVar43._4_4_ = (float)local_580._4_4_ * (float)local_400._4_4_;
            auVar43._0_4_ = (float)local_580._0_4_ * (float)local_400._0_4_;
            auVar43._8_4_ = fStack_578 * fStack_3f8;
            auVar43._12_4_ = fStack_574 * fVar71;
            auVar43._16_4_ = fStack_570 * fStack_3f0;
            auVar43._20_4_ = fStack_56c * fStack_3ec;
            auVar43._24_4_ = fStack_568 * fStack_3e8;
            auVar43._28_4_ = auVar103._28_4_;
            auVar12 = vfmadd213ps_fma(auVar142,local_320,auVar43);
            auVar12 = vfmadd213ps_fma(local_480,local_3e0,ZEXT1632(auVar12));
            auVar12 = vfmadd132ps_fma(auVar179,ZEXT1632(auVar12),local_720);
            auVar44._4_4_ = auVar78._4_4_ * (float)local_580._4_4_;
            auVar44._0_4_ = auVar78._0_4_ * (float)local_580._0_4_;
            auVar44._8_4_ = auVar78._8_4_ * fStack_578;
            auVar44._12_4_ = auVar78._12_4_ * fStack_574;
            auVar44._16_4_ = auVar78._16_4_ * fStack_570;
            auVar44._20_4_ = auVar78._20_4_ * fStack_56c;
            auVar44._24_4_ = auVar78._24_4_ * fStack_568;
            auVar44._28_4_ = auVar103._28_4_;
            auVar13 = vfmadd213ps_fma(auVar133,local_320,auVar44);
            auVar13 = vfmadd213ps_fma(local_780,local_3e0,ZEXT1632(auVar13));
            auVar142 = *(undefined1 (*) [32])(lVar20 + 0x22284f4 + lVar83 * 4);
            auVar103 = *(undefined1 (*) [32])(lVar20 + 0x2228978 + lVar83 * 4);
            auVar105 = *(undefined1 (*) [32])(lVar20 + 0x2228dfc + lVar83 * 4);
            pfVar3 = (float *)(lVar20 + 0x2229280 + lVar83 * 4);
            fVar125 = *pfVar3;
            fVar106 = pfVar3[1];
            fVar107 = pfVar3[2];
            fVar108 = pfVar3[3];
            fVar109 = pfVar3[4];
            fVar110 = pfVar3[5];
            fVar111 = pfVar3[6];
            auVar171._0_4_ = fVar125 * local_680;
            auVar171._4_4_ = fVar106 * fStack_67c;
            auVar171._8_4_ = fVar107 * fStack_678;
            auVar171._12_4_ = fVar108 * fStack_674;
            auVar171._16_4_ = fVar109 * fStack_670;
            auVar171._20_4_ = fVar110 * fStack_66c;
            auVar171._24_4_ = fVar111 * fStack_668;
            auVar171._28_4_ = 0;
            local_180 = auVar97;
            auVar45._4_4_ = fVar106 * fStack_5fc;
            auVar45._0_4_ = fVar125 * local_600;
            auVar45._8_4_ = fVar107 * fStack_5f8;
            auVar45._12_4_ = fVar108 * fStack_5f4;
            auVar45._16_4_ = fVar109 * fStack_5f0;
            auVar45._20_4_ = fVar110 * fStack_5ec;
            auVar45._24_4_ = fVar111 * fStack_5e8;
            auVar45._28_4_ = uStack_7a4;
            auVar46._4_4_ = fVar106 * (float)local_580._4_4_;
            auVar46._0_4_ = fVar125 * (float)local_580._0_4_;
            auVar46._8_4_ = fVar107 * fStack_578;
            auVar46._12_4_ = fVar108 * fStack_574;
            auVar46._16_4_ = fVar109 * fStack_570;
            auVar46._20_4_ = fVar110 * fStack_56c;
            auVar46._24_4_ = fVar111 * fStack_568;
            auVar46._28_4_ = pfVar3[7];
            auVar15 = vfmadd231ps_fma(auVar171,auVar105,auVar182);
            auVar16 = vfmadd231ps_fma(auVar45,auVar105,local_6c0);
            auVar92 = vfmadd231ps_fma(auVar46,local_320,auVar105);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar103,local_740);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar103,local_5c0);
            auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),local_3e0,auVar103);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar142,local_760);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar142,local_460);
            auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar142,local_720);
            pfVar3 = (float *)(lVar20 + 0x222b6a0 + lVar83 * 4);
            fVar125 = *pfVar3;
            fVar106 = pfVar3[1];
            fVar107 = pfVar3[2];
            fVar108 = pfVar3[3];
            fVar109 = pfVar3[4];
            fVar110 = pfVar3[5];
            fVar111 = pfVar3[6];
            auVar47._4_4_ = fStack_67c * fVar106;
            auVar47._0_4_ = local_680 * fVar125;
            auVar47._8_4_ = fStack_678 * fVar107;
            auVar47._12_4_ = fStack_674 * fVar108;
            auVar47._16_4_ = fStack_670 * fVar109;
            auVar47._20_4_ = fStack_66c * fVar110;
            auVar47._24_4_ = fStack_668 * fVar111;
            auVar47._28_4_ = local_4a0._28_4_;
            auVar48._4_4_ = fStack_5fc * fVar106;
            auVar48._0_4_ = local_600 * fVar125;
            auVar48._8_4_ = fStack_5f8 * fVar107;
            auVar48._12_4_ = fStack_5f4 * fVar108;
            auVar48._16_4_ = fStack_5f0 * fVar109;
            auVar48._20_4_ = fStack_5ec * fVar110;
            auVar48._24_4_ = fStack_5e8 * fVar111;
            auVar48._28_4_ = local_360._28_4_;
            auVar49._4_4_ = fVar106 * (float)local_580._4_4_;
            auVar49._0_4_ = fVar125 * (float)local_580._0_4_;
            auVar49._8_4_ = fVar107 * fStack_578;
            auVar49._12_4_ = fVar108 * fStack_574;
            auVar49._16_4_ = fVar109 * fStack_570;
            auVar49._20_4_ = fVar110 * fStack_56c;
            auVar49._24_4_ = fVar111 * fStack_568;
            auVar49._28_4_ = pfVar3[7];
            auVar142 = *(undefined1 (*) [32])(lVar20 + 0x222b21c + lVar83 * 4);
            auVar91 = vfmadd231ps_fma(auVar47,auVar142,auVar182);
            auVar126 = vfmadd231ps_fma(auVar48,auVar142,local_6c0);
            auVar115 = vfmadd231ps_fma(auVar49,local_320,auVar142);
            auVar142 = *(undefined1 (*) [32])(lVar20 + 0x222ad98 + lVar83 * 4);
            auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar142,local_740);
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar142,local_5c0);
            auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar142,local_3e0);
            auVar142 = *(undefined1 (*) [32])(lVar20 + 0x222a914 + lVar83 * 4);
            auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar142,local_760);
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar142,local_460);
            auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),local_720,auVar142);
            auVar178._8_4_ = 0x7fffffff;
            auVar178._0_8_ = 0x7fffffff7fffffff;
            auVar178._12_4_ = 0x7fffffff;
            auVar178._16_4_ = 0x7fffffff;
            auVar178._20_4_ = 0x7fffffff;
            auVar178._24_4_ = 0x7fffffff;
            auVar178._28_4_ = 0x7fffffff;
            auVar142 = vandps_avx(ZEXT1632(auVar15),auVar178);
            auVar103 = vandps_avx(ZEXT1632(auVar16),auVar178);
            auVar103 = vmaxps_avx(auVar142,auVar103);
            auVar142 = vandps_avx(ZEXT1632(auVar92),auVar178);
            auVar142 = vmaxps_avx(auVar103,auVar142);
            auVar77._4_4_ = fStack_dc;
            auVar77._0_4_ = local_e0;
            auVar77._8_4_ = fStack_d8;
            auVar77._12_4_ = fStack_d4;
            auVar77._16_4_ = fStack_d0;
            auVar77._20_4_ = fStack_cc;
            auVar77._24_4_ = fStack_c8;
            auVar77._28_4_ = fStack_c4;
            auVar142 = vcmpps_avx(auVar142,auVar77,1);
            auVar105 = vblendvps_avx(ZEXT1632(auVar15),local_4a0,auVar142);
            auVar175 = vblendvps_avx(ZEXT1632(auVar16),_local_360,auVar142);
            auVar142 = vandps_avx(ZEXT1632(auVar91),auVar178);
            auVar103 = vandps_avx(ZEXT1632(auVar126),auVar178);
            auVar103 = vmaxps_avx(auVar142,auVar103);
            auVar142 = vandps_avx(auVar178,ZEXT1632(auVar115));
            auVar142 = vmaxps_avx(auVar103,auVar142);
            auVar103 = vcmpps_avx(auVar142,auVar77,1);
            auVar142 = vblendvps_avx(ZEXT1632(auVar91),local_4a0,auVar103);
            auVar103 = vblendvps_avx(ZEXT1632(auVar126),_local_360,auVar103);
            auVar13 = vfmadd213ps_fma(auVar150,local_720,ZEXT1632(auVar13));
            auVar15 = vfmadd213ps_fma(auVar105,auVar105,ZEXT832(0) << 0x20);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar175,auVar175);
            auVar150 = vrsqrtps_avx(ZEXT1632(auVar15));
            fVar125 = auVar150._0_4_;
            fVar106 = auVar150._4_4_;
            fVar107 = auVar150._8_4_;
            fVar108 = auVar150._12_4_;
            fVar109 = auVar150._16_4_;
            fVar110 = auVar150._20_4_;
            fVar111 = auVar150._24_4_;
            auVar50._4_4_ = fVar106 * fVar106 * fVar106 * auVar15._4_4_ * -0.5;
            auVar50._0_4_ = fVar125 * fVar125 * fVar125 * auVar15._0_4_ * -0.5;
            auVar50._8_4_ = fVar107 * fVar107 * fVar107 * auVar15._8_4_ * -0.5;
            auVar50._12_4_ = fVar108 * fVar108 * fVar108 * auVar15._12_4_ * -0.5;
            auVar50._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
            auVar50._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
            auVar50._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
            auVar50._28_4_ = 0;
            auVar198._8_4_ = 0x3fc00000;
            auVar198._0_8_ = 0x3fc000003fc00000;
            auVar198._12_4_ = 0x3fc00000;
            auVar198._16_4_ = 0x3fc00000;
            auVar198._20_4_ = 0x3fc00000;
            auVar198._24_4_ = 0x3fc00000;
            auVar198._28_4_ = 0x3fc00000;
            auVar15 = vfmadd231ps_fma(auVar50,auVar198,auVar150);
            fVar125 = auVar15._0_4_;
            fVar106 = auVar15._4_4_;
            auVar51._4_4_ = auVar175._4_4_ * fVar106;
            auVar51._0_4_ = auVar175._0_4_ * fVar125;
            fVar107 = auVar15._8_4_;
            auVar51._8_4_ = auVar175._8_4_ * fVar107;
            fVar108 = auVar15._12_4_;
            auVar51._12_4_ = auVar175._12_4_ * fVar108;
            auVar51._16_4_ = auVar175._16_4_ * 0.0;
            auVar51._20_4_ = auVar175._20_4_ * 0.0;
            auVar51._24_4_ = auVar175._24_4_ * 0.0;
            auVar51._28_4_ = auVar150._28_4_;
            auVar52._4_4_ = fVar106 * -auVar105._4_4_;
            auVar52._0_4_ = fVar125 * -auVar105._0_4_;
            auVar52._8_4_ = fVar107 * -auVar105._8_4_;
            auVar52._12_4_ = fVar108 * -auVar105._12_4_;
            auVar52._16_4_ = -auVar105._16_4_ * 0.0;
            auVar52._20_4_ = -auVar105._20_4_ * 0.0;
            auVar52._24_4_ = -auVar105._24_4_ * 0.0;
            auVar52._28_4_ = auVar175._28_4_;
            auVar15 = vfmadd213ps_fma(auVar142,auVar142,ZEXT832(0) << 0x20);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar103,auVar103);
            auVar150 = vrsqrtps_avx(ZEXT1632(auVar15));
            auVar53._28_4_ = local_360._28_4_;
            auVar53._0_28_ =
                 ZEXT1628(CONCAT412(fVar108 * 0.0,
                                    CONCAT48(fVar107 * 0.0,CONCAT44(fVar106 * 0.0,fVar125 * 0.0))));
            fVar125 = auVar150._0_4_;
            fVar106 = auVar150._4_4_;
            fVar107 = auVar150._8_4_;
            fVar108 = auVar150._12_4_;
            fVar109 = auVar150._16_4_;
            fVar110 = auVar150._20_4_;
            fVar111 = auVar150._24_4_;
            auVar54._4_4_ = fVar106 * fVar106 * fVar106 * auVar15._4_4_ * -0.5;
            auVar54._0_4_ = fVar125 * fVar125 * fVar125 * auVar15._0_4_ * -0.5;
            auVar54._8_4_ = fVar107 * fVar107 * fVar107 * auVar15._8_4_ * -0.5;
            auVar54._12_4_ = fVar108 * fVar108 * fVar108 * auVar15._12_4_ * -0.5;
            auVar54._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
            auVar54._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
            auVar54._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
            auVar54._28_4_ = 0;
            auVar15 = vfmadd231ps_fma(auVar54,auVar198,auVar150);
            fVar125 = auVar15._0_4_;
            fVar106 = auVar15._4_4_;
            auVar55._4_4_ = auVar103._4_4_ * fVar106;
            auVar55._0_4_ = auVar103._0_4_ * fVar125;
            fVar107 = auVar15._8_4_;
            auVar55._8_4_ = auVar103._8_4_ * fVar107;
            fVar108 = auVar15._12_4_;
            auVar55._12_4_ = auVar103._12_4_ * fVar108;
            auVar55._16_4_ = auVar103._16_4_ * 0.0;
            auVar55._20_4_ = auVar103._20_4_ * 0.0;
            auVar55._24_4_ = auVar103._24_4_ * 0.0;
            auVar55._28_4_ = 0;
            auVar56._4_4_ = fVar106 * -auVar142._4_4_;
            auVar56._0_4_ = fVar125 * -auVar142._0_4_;
            auVar56._8_4_ = fVar107 * -auVar142._8_4_;
            auVar56._12_4_ = fVar108 * -auVar142._12_4_;
            auVar56._16_4_ = -auVar142._16_4_ * 0.0;
            auVar56._20_4_ = -auVar142._20_4_ * 0.0;
            auVar56._24_4_ = -auVar142._24_4_ * 0.0;
            auVar56._28_4_ = auVar150._28_4_;
            auVar57._28_4_ = 0xbf000000;
            auVar57._0_28_ =
                 ZEXT1628(CONCAT412(fVar108 * 0.0,
                                    CONCAT48(fVar107 * 0.0,CONCAT44(fVar106 * 0.0,fVar125 * 0.0))));
            auVar15 = vfmadd213ps_fma(auVar51,ZEXT1632(auVar17),auVar190);
            auVar150 = ZEXT1632(auVar17);
            auVar16 = vfmadd213ps_fma(auVar52,auVar150,auVar136);
            auVar92 = vfmadd213ps_fma(auVar53,auVar150,ZEXT1632(auVar13));
            auVar90 = vfnmadd213ps_fma(auVar51,auVar150,auVar190);
            auVar91 = vfmadd213ps_fma(auVar55,auVar97,local_340);
            auVar116 = vfnmadd213ps_fma(auVar52,auVar150,auVar136);
            auVar126 = vfmadd213ps_fma(auVar56,auVar97,auVar104);
            auVar96 = ZEXT1632(auVar17);
            auVar89 = vfnmadd231ps_fma(ZEXT1632(auVar13),auVar96,auVar53);
            auVar13 = vfmadd213ps_fma(auVar57,auVar97,ZEXT1632(auVar12));
            auVar138 = vfnmadd213ps_fma(auVar55,auVar97,local_340);
            auVar148 = vfnmadd213ps_fma(auVar56,auVar97,auVar104);
            auVar114 = vfnmadd231ps_fma(ZEXT1632(auVar12),auVar97,auVar57);
            auVar150 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar116));
            auVar142 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar89));
            auVar161._0_4_ = auVar150._0_4_ * auVar89._0_4_;
            auVar161._4_4_ = auVar150._4_4_ * auVar89._4_4_;
            auVar161._8_4_ = auVar150._8_4_ * auVar89._8_4_;
            auVar161._12_4_ = auVar150._12_4_ * auVar89._12_4_;
            auVar161._16_4_ = auVar150._16_4_ * 0.0;
            auVar161._20_4_ = auVar150._20_4_ * 0.0;
            auVar161._24_4_ = auVar150._24_4_ * 0.0;
            auVar161._28_4_ = 0;
            auVar115 = vfmsub231ps_fma(auVar161,ZEXT1632(auVar116),auVar142);
            auVar58._4_4_ = auVar90._4_4_ * auVar142._4_4_;
            auVar58._0_4_ = auVar90._0_4_ * auVar142._0_4_;
            auVar58._8_4_ = auVar90._8_4_ * auVar142._8_4_;
            auVar58._12_4_ = auVar90._12_4_ * auVar142._12_4_;
            auVar58._16_4_ = auVar142._16_4_ * 0.0;
            auVar58._20_4_ = auVar142._20_4_ * 0.0;
            auVar58._24_4_ = auVar142._24_4_ * 0.0;
            auVar58._28_4_ = auVar142._28_4_;
            auVar179 = ZEXT1632(auVar90);
            auVar142 = vsubps_avx(ZEXT1632(auVar91),auVar179);
            auVar104 = ZEXT1632(auVar89);
            auVar12 = vfmsub231ps_fma(auVar58,auVar104,auVar142);
            auVar59._4_4_ = auVar116._4_4_ * auVar142._4_4_;
            auVar59._0_4_ = auVar116._0_4_ * auVar142._0_4_;
            auVar59._8_4_ = auVar116._8_4_ * auVar142._8_4_;
            auVar59._12_4_ = auVar116._12_4_ * auVar142._12_4_;
            auVar59._16_4_ = auVar142._16_4_ * 0.0;
            auVar59._20_4_ = auVar142._20_4_ * 0.0;
            auVar59._24_4_ = auVar142._24_4_ * 0.0;
            auVar59._28_4_ = auVar142._28_4_;
            auVar90 = vfmsub231ps_fma(auVar59,auVar179,auVar150);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar90),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
            uStack_7b8 = local_c0._24_4_;
            uStack_7b4 = local_c0._28_4_;
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar115));
            auVar182 = vcmpps_avx(ZEXT1632(auVar12),ZEXT832(0) << 0x20,2);
            local_780 = vblendvps_avx(ZEXT1632(auVar138),ZEXT1632(auVar15),auVar182);
            auVar150 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar16),auVar182);
            auVar142 = vblendvps_avx(ZEXT1632(auVar114),ZEXT1632(auVar92),auVar182);
            auVar103 = vblendvps_avx(auVar179,ZEXT1632(auVar91),auVar182);
            auVar105 = vblendvps_avx(ZEXT1632(auVar116),ZEXT1632(auVar126),auVar182);
            auVar175 = vblendvps_avx(auVar104,ZEXT1632(auVar13),auVar182);
            auVar179 = vblendvps_avx(ZEXT1632(auVar91),auVar179,auVar182);
            auVar136 = vblendvps_avx(ZEXT1632(auVar126),ZEXT1632(auVar116),auVar182);
            auVar12 = vpackssdw_avx(local_c0._0_16_,local_c0._16_16_);
            auVar104 = vblendvps_avx(ZEXT1632(auVar13),auVar104,auVar182);
            auVar179 = vsubps_avx(auVar179,local_780);
            auVar136 = vsubps_avx(auVar136,auVar150);
            auVar190 = vsubps_avx(auVar104,auVar142);
            auVar192 = ZEXT3264(auVar190);
            auVar18 = vsubps_avx(local_780,auVar103);
            auVar19 = vsubps_avx(auVar150,auVar105);
            auVar118 = vsubps_avx(auVar142,auVar175);
            auVar158._0_4_ = auVar190._0_4_ * local_780._0_4_;
            auVar158._4_4_ = auVar190._4_4_ * local_780._4_4_;
            auVar158._8_4_ = auVar190._8_4_ * local_780._8_4_;
            auVar158._12_4_ = auVar190._12_4_ * local_780._12_4_;
            auVar158._16_4_ = auVar190._16_4_ * local_780._16_4_;
            auVar158._20_4_ = auVar190._20_4_ * local_780._20_4_;
            auVar158._24_4_ = auVar190._24_4_ * local_780._24_4_;
            auVar158._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar158,auVar142,auVar179);
            auVar60._4_4_ = auVar179._4_4_ * auVar150._4_4_;
            auVar60._0_4_ = auVar179._0_4_ * auVar150._0_4_;
            auVar60._8_4_ = auVar179._8_4_ * auVar150._8_4_;
            auVar60._12_4_ = auVar179._12_4_ * auVar150._12_4_;
            auVar60._16_4_ = auVar179._16_4_ * auVar150._16_4_;
            auVar60._20_4_ = auVar179._20_4_ * auVar150._20_4_;
            auVar60._24_4_ = auVar179._24_4_ * auVar150._24_4_;
            auVar60._28_4_ = auVar104._28_4_;
            auVar15 = vfmsub231ps_fma(auVar60,local_780,auVar136);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar159._0_4_ = auVar136._0_4_ * auVar142._0_4_;
            auVar159._4_4_ = auVar136._4_4_ * auVar142._4_4_;
            auVar159._8_4_ = auVar136._8_4_ * auVar142._8_4_;
            auVar159._12_4_ = auVar136._12_4_ * auVar142._12_4_;
            auVar159._16_4_ = auVar136._16_4_ * auVar142._16_4_;
            auVar159._20_4_ = auVar136._20_4_ * auVar142._20_4_;
            auVar159._24_4_ = auVar136._24_4_ * auVar142._24_4_;
            auVar159._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar159,auVar150,auVar190);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar160._0_4_ = auVar118._0_4_ * auVar103._0_4_;
            auVar160._4_4_ = auVar118._4_4_ * auVar103._4_4_;
            auVar160._8_4_ = auVar118._8_4_ * auVar103._8_4_;
            auVar160._12_4_ = auVar118._12_4_ * auVar103._12_4_;
            auVar160._16_4_ = auVar118._16_4_ * auVar103._16_4_;
            auVar160._20_4_ = auVar118._20_4_ * auVar103._20_4_;
            auVar160._24_4_ = auVar118._24_4_ * auVar103._24_4_;
            auVar160._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar160,auVar18,auVar175);
            auVar61._4_4_ = auVar19._4_4_ * auVar175._4_4_;
            auVar61._0_4_ = auVar19._0_4_ * auVar175._0_4_;
            auVar61._8_4_ = auVar19._8_4_ * auVar175._8_4_;
            auVar61._12_4_ = auVar19._12_4_ * auVar175._12_4_;
            auVar61._16_4_ = auVar19._16_4_ * auVar175._16_4_;
            auVar61._20_4_ = auVar19._20_4_ * auVar175._20_4_;
            auVar61._24_4_ = auVar19._24_4_ * auVar175._24_4_;
            auVar61._28_4_ = auVar175._28_4_;
            auVar16 = vfmsub231ps_fma(auVar61,auVar105,auVar118);
            auVar62._4_4_ = auVar18._4_4_ * auVar105._4_4_;
            auVar62._0_4_ = auVar18._0_4_ * auVar105._0_4_;
            auVar62._8_4_ = auVar18._8_4_ * auVar105._8_4_;
            auVar62._12_4_ = auVar18._12_4_ * auVar105._12_4_;
            auVar62._16_4_ = auVar18._16_4_ * auVar105._16_4_;
            auVar62._20_4_ = auVar18._20_4_ * auVar105._20_4_;
            auVar62._24_4_ = auVar18._24_4_ * auVar105._24_4_;
            auVar62._28_4_ = auVar105._28_4_;
            auVar92 = vfmsub231ps_fma(auVar62,auVar19,auVar103);
            auVar105 = ZEXT832(0) << 0x20;
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar105,ZEXT1632(auVar13));
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar105,ZEXT1632(auVar16));
            auVar103 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
            auVar103 = vcmpps_avx(auVar103,auVar105,2);
            auVar13 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
            auVar13 = vpand_avx(auVar13,auVar12);
            auVar103 = vpmovsxwd_avx2(auVar13);
            if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar103 >> 0x7f,0) == '\0') &&
                  (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar103 >> 0xbf,0) == '\0') &&
                (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar103[0x1f]) {
LAB_0169c0bf:
              auVar145._8_8_ = uStack_4b8;
              auVar145._0_8_ = local_4c0;
              auVar145._16_8_ = uStack_4b0;
              auVar145._24_8_ = uStack_4a8;
            }
            else {
              auVar63._4_4_ = auVar136._4_4_ * auVar118._4_4_;
              auVar63._0_4_ = auVar136._0_4_ * auVar118._0_4_;
              auVar63._8_4_ = auVar136._8_4_ * auVar118._8_4_;
              auVar63._12_4_ = auVar136._12_4_ * auVar118._12_4_;
              auVar63._16_4_ = auVar136._16_4_ * auVar118._16_4_;
              auVar63._20_4_ = auVar136._20_4_ * auVar118._20_4_;
              auVar63._24_4_ = auVar136._24_4_ * auVar118._24_4_;
              auVar63._28_4_ = auVar103._28_4_;
              auVar115 = vfmsub231ps_fma(auVar63,auVar19,auVar190);
              auVar162._0_4_ = auVar190._0_4_ * auVar18._0_4_;
              auVar162._4_4_ = auVar190._4_4_ * auVar18._4_4_;
              auVar162._8_4_ = auVar190._8_4_ * auVar18._8_4_;
              auVar162._12_4_ = auVar190._12_4_ * auVar18._12_4_;
              auVar162._16_4_ = auVar190._16_4_ * auVar18._16_4_;
              auVar162._20_4_ = auVar190._20_4_ * auVar18._20_4_;
              auVar162._24_4_ = auVar190._24_4_ * auVar18._24_4_;
              auVar162._28_4_ = 0;
              auVar126 = vfmsub231ps_fma(auVar162,auVar179,auVar118);
              auVar64._4_4_ = auVar179._4_4_ * auVar19._4_4_;
              auVar64._0_4_ = auVar179._0_4_ * auVar19._0_4_;
              auVar64._8_4_ = auVar179._8_4_ * auVar19._8_4_;
              auVar64._12_4_ = auVar179._12_4_ * auVar19._12_4_;
              auVar64._16_4_ = auVar179._16_4_ * auVar19._16_4_;
              auVar64._20_4_ = auVar179._20_4_ * auVar19._20_4_;
              auVar64._24_4_ = auVar179._24_4_ * auVar19._24_4_;
              auVar64._28_4_ = auVar19._28_4_;
              auVar90 = vfmsub231ps_fma(auVar64,auVar18,auVar136);
              auVar92 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar126),ZEXT1632(auVar90));
              auVar91 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT1632(auVar115),auVar105);
              auVar103 = vrcpps_avx(ZEXT1632(auVar91));
              auVar191._8_4_ = 0x3f800000;
              auVar191._0_8_ = &DAT_3f8000003f800000;
              auVar191._12_4_ = 0x3f800000;
              auVar191._16_4_ = 0x3f800000;
              auVar191._20_4_ = 0x3f800000;
              auVar191._24_4_ = 0x3f800000;
              auVar191._28_4_ = 0x3f800000;
              auVar192 = ZEXT3264(auVar191);
              auVar92 = vfnmadd213ps_fma(auVar103,ZEXT1632(auVar91),auVar191);
              auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar103,auVar103);
              auVar65._4_4_ = auVar90._4_4_ * auVar142._4_4_;
              auVar65._0_4_ = auVar90._0_4_ * auVar142._0_4_;
              auVar65._8_4_ = auVar90._8_4_ * auVar142._8_4_;
              auVar65._12_4_ = auVar90._12_4_ * auVar142._12_4_;
              auVar65._16_4_ = auVar142._16_4_ * 0.0;
              auVar65._20_4_ = auVar142._20_4_ * 0.0;
              auVar65._24_4_ = auVar142._24_4_ * 0.0;
              auVar65._28_4_ = auVar142._28_4_;
              auVar126 = vfmadd231ps_fma(auVar65,auVar150,ZEXT1632(auVar126));
              auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),ZEXT1632(auVar115),local_780);
              fVar106 = auVar92._0_4_;
              fVar107 = auVar92._4_4_;
              fVar108 = auVar92._8_4_;
              fVar109 = auVar92._12_4_;
              auVar103 = ZEXT1632(CONCAT412(fVar109 * auVar126._12_4_,
                                            CONCAT48(fVar108 * auVar126._8_4_,
                                                     CONCAT44(fVar107 * auVar126._4_4_,
                                                              fVar106 * auVar126._0_4_))));
              fVar125 = local_828->tfar;
              auVar144._4_4_ = fVar125;
              auVar144._0_4_ = fVar125;
              auVar144._8_4_ = fVar125;
              auVar144._12_4_ = fVar125;
              auVar144._16_4_ = fVar125;
              auVar144._20_4_ = fVar125;
              auVar144._24_4_ = fVar125;
              auVar144._28_4_ = fVar125;
              auVar76._4_4_ = uStack_fc;
              auVar76._0_4_ = local_100;
              auVar76._8_4_ = uStack_f8;
              auVar76._12_4_ = uStack_f4;
              auVar76._16_4_ = uStack_f0;
              auVar76._20_4_ = uStack_ec;
              auVar76._24_4_ = uStack_e8;
              auVar76._28_4_ = uStack_e4;
              auVar150 = vcmpps_avx(auVar76,auVar103,2);
              auVar142 = vcmpps_avx(auVar103,auVar144,2);
              auVar150 = vandps_avx(auVar142,auVar150);
              auVar92 = vpackssdw_avx(auVar150._0_16_,auVar150._16_16_);
              auVar13 = vpand_avx(auVar13,auVar92);
              auVar150 = vpmovsxwd_avx2(auVar13);
              if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar150 >> 0x7f,0) == '\0') &&
                    (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar150 >> 0xbf,0) == '\0') &&
                  (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar150[0x1f]) goto LAB_0169c0bf;
              auVar150 = vcmpps_avx(ZEXT1632(auVar91),ZEXT832(0) << 0x20,4);
              auVar92 = vpackssdw_avx(auVar150._0_16_,auVar150._16_16_);
              auVar13 = vpand_avx(auVar13,auVar92);
              auVar150 = vpmovsxwd_avx2(auVar13);
              auVar145._8_8_ = uStack_4b8;
              auVar145._0_8_ = local_4c0;
              auVar145._16_8_ = uStack_4b0;
              auVar145._24_8_ = uStack_4a8;
              if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar150 >> 0x7f,0) != '\0') ||
                    (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar150 >> 0xbf,0) != '\0') ||
                  (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar150[0x1f] < '\0') {
                auVar105 = ZEXT1632(CONCAT412(fVar109 * auVar15._12_4_,
                                              CONCAT48(fVar108 * auVar15._8_4_,
                                                       CONCAT44(fVar107 * auVar15._4_4_,
                                                                fVar106 * auVar15._0_4_))));
                auVar66._28_4_ = SUB84(uStack_4a8,4);
                auVar66._0_28_ =
                     ZEXT1628(CONCAT412(fVar109 * auVar16._12_4_,
                                        CONCAT48(fVar108 * auVar16._8_4_,
                                                 CONCAT44(fVar107 * auVar16._4_4_,
                                                          fVar106 * auVar16._0_4_))));
                auVar172._8_4_ = 0x3f800000;
                auVar172._0_8_ = &DAT_3f8000003f800000;
                auVar172._12_4_ = 0x3f800000;
                auVar172._16_4_ = 0x3f800000;
                auVar172._20_4_ = 0x3f800000;
                auVar172._24_4_ = 0x3f800000;
                auVar172._28_4_ = 0x3f800000;
                auVar142 = vsubps_avx(auVar172,auVar105);
                _local_1a0 = vblendvps_avx(auVar142,auVar105,auVar182);
                auVar142 = vsubps_avx(auVar172,auVar66);
                local_3c0 = vblendvps_avx(auVar142,auVar66,auVar182);
                auVar145 = auVar150;
                local_420 = auVar103;
              }
            }
            auVar206 = ZEXT3264(local_760);
            auVar199 = ZEXT3264(local_740);
            auVar183 = ZEXT3264(local_6a0);
            if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar145 >> 0x7f,0) == '\0') &&
                  (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar145 >> 0xbf,0) == '\0') &&
                (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar145[0x1f]) {
              auVar146 = ZEXT3264(local_5c0);
              auVar124 = ZEXT3264(local_6c0);
              auVar163 = ZEXT3264(CONCAT428(fStack_5e4,
                                            CONCAT424(fStack_5e8,
                                                      CONCAT420(fStack_5ec,
                                                                CONCAT416(fStack_5f0,
                                                                          CONCAT412(fStack_5f4,
                                                                                    CONCAT48(
                                                  fStack_5f8,CONCAT44(fStack_5fc,local_600))))))));
              auVar173 = ZEXT3264(CONCAT428(fStack_664,
                                            CONCAT424(fStack_668,
                                                      CONCAT420(fStack_66c,
                                                                CONCAT416(fStack_670,
                                                                          CONCAT412(fStack_674,
                                                                                    CONCAT48(
                                                  fStack_678,CONCAT44(fStack_67c,local_680))))))));
            }
            else {
              auVar150 = vsubps_avx(auVar97,auVar96);
              auVar13 = vfmadd213ps_fma(auVar150,_local_1a0,auVar96);
              fVar125 = local_788->depth_scale;
              auVar67._4_4_ = (auVar13._4_4_ + auVar13._4_4_) * fVar125;
              auVar67._0_4_ = (auVar13._0_4_ + auVar13._0_4_) * fVar125;
              auVar67._8_4_ = (auVar13._8_4_ + auVar13._8_4_) * fVar125;
              auVar67._12_4_ = (auVar13._12_4_ + auVar13._12_4_) * fVar125;
              auVar67._16_4_ = fVar125 * 0.0;
              auVar67._20_4_ = fVar125 * 0.0;
              auVar67._24_4_ = fVar125 * 0.0;
              auVar67._28_4_ = fVar125;
              auVar150 = vcmpps_avx(local_420,auVar67,6);
              auVar142 = auVar145 & auVar150;
              auVar163 = ZEXT3264(CONCAT428(fStack_5e4,
                                            CONCAT424(fStack_5e8,
                                                      CONCAT420(fStack_5ec,
                                                                CONCAT416(fStack_5f0,
                                                                          CONCAT412(fStack_5f4,
                                                                                    CONCAT48(
                                                  fStack_5f8,CONCAT44(fStack_5fc,local_600))))))));
              auVar173 = ZEXT3264(CONCAT428(fStack_664,
                                            CONCAT424(fStack_668,
                                                      CONCAT420(fStack_66c,
                                                                CONCAT416(fStack_670,
                                                                          CONCAT412(fStack_674,
                                                                                    CONCAT48(
                                                  fStack_678,CONCAT44(fStack_67c,local_680))))))));
              if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar142 >> 0x7f,0) == '\0') &&
                    (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar142 >> 0xbf,0) == '\0') &&
                  (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar142[0x1f]) {
                auVar146 = ZEXT3264(local_5c0);
                auVar124 = ZEXT3264(local_6c0);
              }
              else {
                local_220 = vandps_avx(auVar150,auVar145);
                auVar123._8_4_ = 0xbf800000;
                auVar123._0_8_ = 0xbf800000bf800000;
                auVar123._12_4_ = 0xbf800000;
                auVar123._16_4_ = 0xbf800000;
                auVar123._20_4_ = 0xbf800000;
                auVar123._24_4_ = 0xbf800000;
                auVar123._28_4_ = 0xbf800000;
                auVar137._8_4_ = 0x40000000;
                auVar137._0_8_ = 0x4000000040000000;
                auVar137._12_4_ = 0x40000000;
                auVar137._16_4_ = 0x40000000;
                auVar137._20_4_ = 0x40000000;
                auVar137._24_4_ = 0x40000000;
                auVar137._28_4_ = 0x40000000;
                auVar13 = vfmadd213ps_fma(local_3c0,auVar137,auVar123);
                local_2e0 = _local_1a0;
                local_2c0 = ZEXT1632(auVar13);
                local_2a0 = local_420;
                local_27c = iVar8;
                local_270 = local_590._0_8_;
                uStack_268 = local_590._8_8_;
                local_260 = local_4d0._0_8_;
                uStack_258 = local_4d0._8_8_;
                local_250 = local_4e0._0_8_;
                uStack_248 = local_4e0._8_8_;
                local_240 = local_430._0_8_;
                uStack_238 = local_430._8_8_;
                pGVar9 = (local_830->scene->geometries).items[local_790].ptr;
                local_3c0 = ZEXT1632(auVar13);
                auVar150 = local_3c0;
                if ((pGVar9->mask & local_828->mask) == 0) {
                  bVar80 = 0;
                  auVar124 = ZEXT3264(local_6c0);
                }
                else {
                  auVar124 = ZEXT3264(local_6c0);
                  if ((local_830->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar80 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_7c0 = SUB84(pGVar9,0);
                    uStack_7bc = (undefined4)((ulong)pGVar9 >> 0x20);
                    fVar125 = (float)local_280;
                    local_200[0] = (fVar125 + (float)local_1a0._0_4_ + 0.0) * local_120;
                    local_200[1] = (fVar125 + (float)local_1a0._4_4_ + 1.0) * fStack_11c;
                    local_200[2] = (fVar125 + fStack_198 + 2.0) * fStack_118;
                    local_200[3] = (fVar125 + fStack_194 + 3.0) * fStack_114;
                    fStack_1f0 = (fVar125 + fStack_190 + 4.0) * fStack_110;
                    fStack_1ec = (fVar125 + fStack_18c + 5.0) * fStack_10c;
                    fStack_1e8 = (fVar125 + fStack_188 + 6.0) * fStack_108;
                    fStack_1e4 = fVar125 + fStack_184 + 7.0;
                    local_3c0._0_8_ = auVar13._0_8_;
                    local_3c0._8_8_ = auVar13._8_8_;
                    local_1e0 = local_3c0._0_8_;
                    uStack_1d8 = local_3c0._8_8_;
                    uStack_1d0 = 0;
                    uStack_1c8 = 0;
                    local_1c0 = local_420;
                    uVar85 = vmovmskps_avx(local_220);
                    local_620._4_28_ = auVar133._4_28_;
                    local_620._0_4_ = (int)CONCAT71((int7)((ulong)pGVar9 >> 8),uVar85 != 0);
                    local_3c0 = auVar150;
                    if (uVar85 != 0) {
                      uVar82 = (ulong)(uVar85 & 0xff);
                      local_800 = ZEXT1632(CONCAT88(auVar17._8_8_,uVar82));
                      lVar86 = 0;
                      for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
                        lVar86 = lVar86 + 1;
                      }
                      local_820 = ZEXT1632(CONCAT88(auVar12._8_8_,lVar86));
                      local_5e0 = ZEXT1632(local_4d0);
                      local_540 = ZEXT1632(local_4e0);
                      _local_560 = ZEXT1632(local_430);
                      _local_400 = auVar14;
                      do {
                        local_654 = local_200[local_820._0_8_];
                        local_650 = *(undefined4 *)((long)&local_1e0 + local_820._0_8_ * 4);
                        local_780._0_4_ = local_828->tfar;
                        local_828->tfar = *(float *)(local_1c0 + local_820._0_8_ * 4);
                        local_6f0.context = local_830->user;
                        fVar106 = 1.0 - local_654;
                        fVar125 = fVar106 * fVar106 * -3.0;
                        auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar106 * fVar106)),
                                                  ZEXT416((uint)(local_654 * fVar106)),
                                                  ZEXT416(0xc0000000));
                        auVar12 = vfmsub132ss_fma(ZEXT416((uint)(local_654 * fVar106)),
                                                  ZEXT416((uint)(local_654 * local_654)),
                                                  ZEXT416(0x40000000));
                        fVar106 = auVar17._0_4_ * 3.0;
                        fVar107 = auVar12._0_4_ * 3.0;
                        fVar108 = local_654 * local_654 * 3.0;
                        auVar155._0_4_ = fVar108 * (float)local_560._0_4_;
                        auVar155._4_4_ = fVar108 * (float)local_560._4_4_;
                        auVar155._8_4_ = fVar108 * fStack_558;
                        auVar155._12_4_ = fVar108 * fStack_554;
                        auVar131._4_4_ = fVar107;
                        auVar131._0_4_ = fVar107;
                        auVar131._8_4_ = fVar107;
                        auVar131._12_4_ = fVar107;
                        auVar17 = vfmadd132ps_fma(auVar131,auVar155,local_540._0_16_);
                        auVar141._4_4_ = fVar106;
                        auVar141._0_4_ = fVar106;
                        auVar141._8_4_ = fVar106;
                        auVar141._12_4_ = fVar106;
                        auVar17 = vfmadd132ps_fma(auVar141,auVar17,local_5e0._0_16_);
                        auVar132._4_4_ = fVar125;
                        auVar132._0_4_ = fVar125;
                        auVar132._8_4_ = fVar125;
                        auVar132._12_4_ = fVar125;
                        auVar17 = vfmadd132ps_fma(auVar132,auVar17,local_590);
                        local_660 = vmovlps_avx(auVar17);
                        local_658 = vextractps_avx(auVar17,2);
                        local_64c = (int)local_628;
                        local_648 = (int)local_790;
                        local_644 = (local_6f0.context)->instID[0];
                        local_640 = (local_6f0.context)->instPrimID[0];
                        local_834 = -1;
                        local_6f0.valid = &local_834;
                        local_6f0.geometryUserPtr =
                             *(void **)(CONCAT44(uStack_7bc,local_7c0) + 0x18);
                        local_6f0.ray = (RTCRayN *)local_828;
                        local_6f0.hit = (RTCHitN *)&local_660;
                        local_6f0.N = 1;
                        pcVar10 = *(code **)(CONCAT44(uStack_7bc,local_7c0) + 0x48);
                        if (pcVar10 == (code *)0x0) {
LAB_0169bfb1:
                          p_Var11 = local_830->args->filter;
                          if (p_Var11 == (RTCFilterFunctionN)0x0) break;
                          if (((local_830->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                               != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)(CONCAT44(uStack_7bc,local_7c0) + 0x3e) & 0x40) != 0)) {
                            auVar192 = ZEXT1664(auVar192._0_16_);
                            (*p_Var11)(&local_6f0);
                          }
                          if (*local_6f0.valid != 0) break;
                        }
                        else {
                          auVar192 = ZEXT1664(auVar192._0_16_);
                          (*pcVar10)(&local_6f0);
                          if (*local_6f0.valid != 0) goto LAB_0169bfb1;
                        }
                        local_828->tfar = (float)local_780._0_4_;
                        uVar84 = local_800._0_8_ ^ 1L << (local_820._0_8_ & 0x3f);
                        local_800._0_8_ = uVar84;
                        lVar86 = 0;
                        for (uVar82 = uVar84; (uVar82 & 1) == 0;
                            uVar82 = uVar82 >> 1 | 0x8000000000000000) {
                          lVar86 = lVar86 + 1;
                        }
                        local_820._0_8_ = lVar86;
                        local_620._0_4_ = (int)CONCAT71((int7)((ulong)lVar86 >> 8),uVar84 != 0);
                      } while (uVar84 != 0);
                    }
                    bVar80 = local_620[0] & 1;
                    auVar124 = ZEXT3264(local_6c0);
                    auVar163 = ZEXT3264(CONCAT428(fStack_5e4,
                                                  CONCAT424(fStack_5e8,
                                                            CONCAT420(fStack_5ec,
                                                                      CONCAT416(fStack_5f0,
                                                                                CONCAT412(fStack_5f4
                                                                                          ,CONCAT48(
                                                  fStack_5f8,CONCAT44(fStack_5fc,local_600))))))));
                    auVar183 = ZEXT3264(local_6a0);
                    auVar173 = ZEXT3264(CONCAT428(fStack_664,
                                                  CONCAT424(fStack_668,
                                                            CONCAT420(fStack_66c,
                                                                      CONCAT416(fStack_670,
                                                                                CONCAT412(fStack_674
                                                                                          ,CONCAT48(
                                                  fStack_678,CONCAT44(fStack_67c,local_680))))))));
                    auVar199 = ZEXT3264(local_740);
                    auVar206 = ZEXT3264(local_760);
                  }
                }
                bVar87 = (bool)(bVar87 | bVar80);
                auVar146 = ZEXT3264(local_5c0);
              }
            }
          }
          lVar83 = lVar83 + 8;
        } while ((int)lVar83 < iVar8);
      }
      if (bVar87 != false) {
        return local_835;
      }
      fVar125 = local_828->tfar;
      auVar95._4_4_ = fVar125;
      auVar95._0_4_ = fVar125;
      auVar95._8_4_ = fVar125;
      auVar95._12_4_ = fVar125;
      auVar17 = vcmpps_avx(local_300,auVar95,2);
      uVar85 = vmovmskps_avx(auVar17);
      uVar81 = uVar81 & uVar81 + 0xf & uVar85;
      local_835 = uVar81 != 0;
      ray = local_828;
      prim = local_7c8;
      context = local_830;
    } while (local_835);
  }
  return local_835;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }